

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx512::CurveNvIntersector1<8>::
     occluded_t<embree::avx512::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Primitive PVar13;
  int iVar14;
  Geometry *pGVar15;
  RTCFilterFunctionN p_Var16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined8 uVar23;
  long lVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  long lVar70;
  byte bVar71;
  uint uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  Geometry *geometry;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar81;
  undefined1 auVar87 [16];
  long lVar76;
  bool bVar77;
  ulong uVar78;
  byte bVar79;
  float fVar80;
  float fVar126;
  float fVar127;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar86 [16];
  float fVar128;
  float fVar130;
  float fVar131;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar129;
  float fVar132;
  float fVar133;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar134;
  undefined4 uVar135;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined8 uVar141;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar152;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar163;
  float fVar165;
  undefined1 auVar164 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  undefined1 auVar179 [16];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  RTCFilterFunctionNArguments args;
  int local_54c;
  Ray *local_548;
  Primitive *local_540;
  Precalculations *local_538;
  undefined4 local_52c;
  ulong local_528;
  undefined1 local_520 [16];
  RTCFilterFunctionNArguments local_510;
  undefined8 local_4e0;
  undefined4 local_4d8;
  float local_4d4;
  undefined4 local_4d0;
  undefined4 local_4cc;
  undefined4 local_4c8;
  uint local_4c4;
  uint local_4c0;
  Geometry *local_4b0;
  RayQueryContext *local_4a8;
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_310 [8];
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  int local_1fc;
  undefined1 local_1f0 [16];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar13 = prim[1];
  uVar73 = (ulong)(byte)PVar13;
  lVar70 = uVar73 * 0x19;
  fVar163 = *(float *)(prim + lVar70 + 0x12);
  local_538 = pre;
  auVar142 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar70 + 6));
  fVar152 = fVar163 * auVar142._0_4_;
  fVar134 = fVar163 * (ray->dir).field_0.m128[0];
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar73 * 4 + 6);
  auVar94 = vpmovsxbd_avx2(auVar83);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar73 * 5 + 6);
  auVar91 = vpmovsxbd_avx2(auVar82);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar73 * 6 + 6);
  auVar92 = vpmovsxbd_avx2(auVar87);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar179._8_8_ = 0;
  auVar179._0_8_ = *(ulong *)(prim + uVar73 * 0xb + 6);
  auVar93 = vpmovsxbd_avx2(auVar179);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar13 * 0xc) + 6);
  auVar98 = vpmovsxbd_avx2(auVar8);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar96 = vcvtdq2ps_avx(auVar98);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (uint)(byte)PVar13 * 0xc + uVar73 + 6);
  auVar95 = vpmovsxbd_avx2(auVar9);
  auVar95 = vcvtdq2ps_avx(auVar95);
  uVar78 = (ulong)(uint)((int)(uVar73 * 9) * 2);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar78 + 6);
  auVar104 = vpmovsxbd_avx2(auVar10);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar78 + uVar73 + 6);
  auVar103 = vpmovsxbd_avx2(auVar11);
  auVar103 = vcvtdq2ps_avx(auVar103);
  uVar75 = (ulong)(uint)((int)(uVar73 * 5) << 2);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar75 + 6);
  auVar90 = vpmovsxbd_avx2(auVar12);
  auVar97 = vcvtdq2ps_avx(auVar90);
  auVar173._4_4_ = fVar134;
  auVar173._0_4_ = fVar134;
  auVar173._8_4_ = fVar134;
  auVar173._12_4_ = fVar134;
  auVar173._16_4_ = fVar134;
  auVar173._20_4_ = fVar134;
  auVar173._24_4_ = fVar134;
  auVar173._28_4_ = fVar134;
  auVar175._8_4_ = 1;
  auVar175._0_8_ = 0x100000001;
  auVar175._12_4_ = 1;
  auVar175._16_4_ = 1;
  auVar175._20_4_ = 1;
  auVar175._24_4_ = 1;
  auVar175._28_4_ = 1;
  auVar88 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar100 = ZEXT1632(CONCAT412(fVar163 * (ray->dir).field_0.m128[3],
                                CONCAT48(fVar163 * (ray->dir).field_0.m128[2],
                                         CONCAT44(fVar163 * (ray->dir).field_0.m128[1],fVar134))));
  auVar99 = vpermps_avx2(auVar175,auVar100);
  auVar89 = vpermps_avx512vl(auVar88,auVar100);
  fVar134 = auVar89._0_4_;
  fVar138 = auVar89._4_4_;
  auVar100._4_4_ = fVar138 * auVar92._4_4_;
  auVar100._0_4_ = fVar134 * auVar92._0_4_;
  fVar139 = auVar89._8_4_;
  auVar100._8_4_ = fVar139 * auVar92._8_4_;
  fVar140 = auVar89._12_4_;
  auVar100._12_4_ = fVar140 * auVar92._12_4_;
  fVar165 = auVar89._16_4_;
  auVar100._16_4_ = fVar165 * auVar92._16_4_;
  fVar80 = auVar89._20_4_;
  auVar100._20_4_ = fVar80 * auVar92._20_4_;
  fVar81 = auVar89._24_4_;
  auVar100._24_4_ = fVar81 * auVar92._24_4_;
  auVar100._28_4_ = auVar98._28_4_;
  auVar98._4_4_ = auVar95._4_4_ * fVar138;
  auVar98._0_4_ = auVar95._0_4_ * fVar134;
  auVar98._8_4_ = auVar95._8_4_ * fVar139;
  auVar98._12_4_ = auVar95._12_4_ * fVar140;
  auVar98._16_4_ = auVar95._16_4_ * fVar165;
  auVar98._20_4_ = auVar95._20_4_ * fVar80;
  auVar98._24_4_ = auVar95._24_4_ * fVar81;
  auVar98._28_4_ = auVar90._28_4_;
  auVar90._4_4_ = auVar97._4_4_ * fVar138;
  auVar90._0_4_ = auVar97._0_4_ * fVar134;
  auVar90._8_4_ = auVar97._8_4_ * fVar139;
  auVar90._12_4_ = auVar97._12_4_ * fVar140;
  auVar90._16_4_ = auVar97._16_4_ * fVar165;
  auVar90._20_4_ = auVar97._20_4_ * fVar80;
  auVar90._24_4_ = auVar97._24_4_ * fVar81;
  auVar90._28_4_ = auVar89._28_4_;
  auVar83 = vfmadd231ps_fma(auVar100,auVar99,auVar91);
  auVar82 = vfmadd231ps_fma(auVar98,auVar99,auVar96);
  auVar87 = vfmadd231ps_fma(auVar90,auVar103,auVar99);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar173,auVar94);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar173,auVar93);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar104,auVar173);
  auVar174._4_4_ = fVar152;
  auVar174._0_4_ = fVar152;
  auVar174._8_4_ = fVar152;
  auVar174._12_4_ = fVar152;
  auVar174._16_4_ = fVar152;
  auVar174._20_4_ = fVar152;
  auVar174._24_4_ = fVar152;
  auVar174._28_4_ = fVar152;
  auVar90 = ZEXT1632(CONCAT412(fVar163 * auVar142._12_4_,
                               CONCAT48(fVar163 * auVar142._8_4_,
                                        CONCAT44(fVar163 * auVar142._4_4_,fVar152))));
  auVar98 = vpermps_avx2(auVar175,auVar90);
  auVar90 = vpermps_avx512vl(auVar88,auVar90);
  fVar163 = auVar90._0_4_;
  fVar134 = auVar90._4_4_;
  auVar99._4_4_ = fVar134 * auVar92._4_4_;
  auVar99._0_4_ = fVar163 * auVar92._0_4_;
  fVar138 = auVar90._8_4_;
  auVar99._8_4_ = fVar138 * auVar92._8_4_;
  fVar139 = auVar90._12_4_;
  auVar99._12_4_ = fVar139 * auVar92._12_4_;
  fVar140 = auVar90._16_4_;
  auVar99._16_4_ = fVar140 * auVar92._16_4_;
  fVar165 = auVar90._20_4_;
  auVar99._20_4_ = fVar165 * auVar92._20_4_;
  fVar80 = auVar90._24_4_;
  auVar99._24_4_ = fVar80 * auVar92._24_4_;
  auVar99._28_4_ = 1;
  auVar88._4_4_ = auVar95._4_4_ * fVar134;
  auVar88._0_4_ = auVar95._0_4_ * fVar163;
  auVar88._8_4_ = auVar95._8_4_ * fVar138;
  auVar88._12_4_ = auVar95._12_4_ * fVar139;
  auVar88._16_4_ = auVar95._16_4_ * fVar140;
  auVar88._20_4_ = auVar95._20_4_ * fVar165;
  auVar88._24_4_ = auVar95._24_4_ * fVar80;
  auVar88._28_4_ = auVar92._28_4_;
  auVar95._4_4_ = auVar97._4_4_ * fVar134;
  auVar95._0_4_ = auVar97._0_4_ * fVar163;
  auVar95._8_4_ = auVar97._8_4_ * fVar138;
  auVar95._12_4_ = auVar97._12_4_ * fVar139;
  auVar95._16_4_ = auVar97._16_4_ * fVar140;
  auVar95._20_4_ = auVar97._20_4_ * fVar165;
  auVar95._24_4_ = auVar97._24_4_ * fVar80;
  auVar95._28_4_ = auVar90._28_4_;
  auVar179 = vfmadd231ps_fma(auVar99,auVar98,auVar91);
  auVar8 = vfmadd231ps_fma(auVar88,auVar98,auVar96);
  auVar9 = vfmadd231ps_fma(auVar95,auVar98,auVar103);
  auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar174,auVar94);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar174,auVar93);
  auVar166._8_4_ = 0x7fffffff;
  auVar166._0_8_ = 0x7fffffff7fffffff;
  auVar166._12_4_ = 0x7fffffff;
  auVar166._16_4_ = 0x7fffffff;
  auVar166._20_4_ = 0x7fffffff;
  auVar166._24_4_ = 0x7fffffff;
  auVar166._28_4_ = 0x7fffffff;
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar174,auVar104);
  auVar94 = vandps_avx(ZEXT1632(auVar83),auVar166);
  auVar164._8_4_ = 0x219392ef;
  auVar164._0_8_ = 0x219392ef219392ef;
  auVar164._12_4_ = 0x219392ef;
  auVar164._16_4_ = 0x219392ef;
  auVar164._20_4_ = 0x219392ef;
  auVar164._24_4_ = 0x219392ef;
  auVar164._28_4_ = 0x219392ef;
  uVar78 = vcmpps_avx512vl(auVar94,auVar164,1);
  bVar77 = (bool)((byte)uVar78 & 1);
  auVar89._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar83._0_4_;
  bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar83._4_4_;
  bVar77 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar83._8_4_;
  bVar77 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar83._12_4_;
  auVar89._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar89._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar89._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar89._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar94 = vandps_avx(ZEXT1632(auVar82),auVar166);
  uVar78 = vcmpps_avx512vl(auVar94,auVar164,1);
  bVar77 = (bool)((byte)uVar78 & 1);
  auVar101._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar82._0_4_;
  bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar82._4_4_;
  bVar77 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar82._8_4_;
  bVar77 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar82._12_4_;
  auVar101._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar101._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar101._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar101._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar94 = vandps_avx(ZEXT1632(auVar87),auVar166);
  uVar78 = vcmpps_avx512vl(auVar94,auVar164,1);
  bVar77 = (bool)((byte)uVar78 & 1);
  auVar94._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar87._0_4_;
  bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar87._4_4_;
  bVar77 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar87._8_4_;
  bVar77 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar87._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar91 = vrcp14ps_avx512vl(auVar89);
  auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar93 = vfnmadd213ps_avx512vl(auVar89,auVar91,auVar92);
  auVar83 = vfmadd132ps_fma(auVar93,auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar101);
  auVar93 = vfnmadd213ps_avx512vl(auVar101,auVar91,auVar92);
  auVar82 = vfmadd132ps_fma(auVar93,auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar94);
  auVar94 = vfnmadd213ps_avx512vl(auVar94,auVar91,auVar92);
  auVar87 = vfmadd132ps_fma(auVar94,auVar91,auVar91);
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 7 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar179));
  auVar104._4_4_ = auVar83._4_4_ * auVar94._4_4_;
  auVar104._0_4_ = auVar83._0_4_ * auVar94._0_4_;
  auVar104._8_4_ = auVar83._8_4_ * auVar94._8_4_;
  auVar104._12_4_ = auVar83._12_4_ * auVar94._12_4_;
  auVar104._16_4_ = auVar94._16_4_ * 0.0;
  auVar104._20_4_ = auVar94._20_4_ * 0.0;
  auVar104._24_4_ = auVar94._24_4_ * 0.0;
  auVar104._28_4_ = auVar94._28_4_;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 9 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar179));
  auVar95 = vpbroadcastd_avx512vl();
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar13 * 0x10 + 6));
  auVar150._0_4_ = auVar83._0_4_ * auVar94._0_4_;
  auVar150._4_4_ = auVar83._4_4_ * auVar94._4_4_;
  auVar150._8_4_ = auVar83._8_4_ * auVar94._8_4_;
  auVar150._12_4_ = auVar83._12_4_ * auVar94._12_4_;
  auVar150._16_4_ = auVar94._16_4_ * 0.0;
  auVar150._20_4_ = auVar94._20_4_ * 0.0;
  auVar150._24_4_ = auVar94._24_4_ * 0.0;
  auVar150._28_4_ = 0;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar13 * 0x10 + uVar73 * -2 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar8));
  auVar103._4_4_ = auVar82._4_4_ * auVar94._4_4_;
  auVar103._0_4_ = auVar82._0_4_ * auVar94._0_4_;
  auVar103._8_4_ = auVar82._8_4_ * auVar94._8_4_;
  auVar103._12_4_ = auVar82._12_4_ * auVar94._12_4_;
  auVar103._16_4_ = auVar94._16_4_ * 0.0;
  auVar103._20_4_ = auVar94._20_4_ * 0.0;
  auVar103._24_4_ = auVar94._24_4_ * 0.0;
  auVar103._28_4_ = auVar94._28_4_;
  auVar94 = vcvtdq2ps_avx(auVar91);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar8));
  auVar144._0_4_ = auVar82._0_4_ * auVar94._0_4_;
  auVar144._4_4_ = auVar82._4_4_ * auVar94._4_4_;
  auVar144._8_4_ = auVar82._8_4_ * auVar94._8_4_;
  auVar144._12_4_ = auVar82._12_4_ * auVar94._12_4_;
  auVar144._16_4_ = auVar94._16_4_ * 0.0;
  auVar144._20_4_ = auVar94._20_4_ * 0.0;
  auVar144._24_4_ = auVar94._24_4_ * 0.0;
  auVar144._28_4_ = 0;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 + uVar73 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar9));
  auVar97._4_4_ = auVar94._4_4_ * auVar87._4_4_;
  auVar97._0_4_ = auVar94._0_4_ * auVar87._0_4_;
  auVar97._8_4_ = auVar94._8_4_ * auVar87._8_4_;
  auVar97._12_4_ = auVar94._12_4_ * auVar87._12_4_;
  auVar97._16_4_ = auVar94._16_4_ * 0.0;
  auVar97._20_4_ = auVar94._20_4_ * 0.0;
  auVar97._24_4_ = auVar94._24_4_ * 0.0;
  auVar97._28_4_ = auVar94._28_4_;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 0x17 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar9));
  auVar102._0_4_ = auVar87._0_4_ * auVar94._0_4_;
  auVar102._4_4_ = auVar87._4_4_ * auVar94._4_4_;
  auVar102._8_4_ = auVar87._8_4_ * auVar94._8_4_;
  auVar102._12_4_ = auVar87._12_4_ * auVar94._12_4_;
  auVar102._16_4_ = auVar94._16_4_ * 0.0;
  auVar102._20_4_ = auVar94._20_4_ * 0.0;
  auVar102._24_4_ = auVar94._24_4_ * 0.0;
  auVar102._28_4_ = 0;
  auVar94 = vpminsd_avx2(auVar104,auVar150);
  auVar91 = vpminsd_avx2(auVar103,auVar144);
  auVar94 = vmaxps_avx(auVar94,auVar91);
  auVar91 = vpminsd_avx2(auVar97,auVar102);
  uVar135 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar92._4_4_ = uVar135;
  auVar92._0_4_ = uVar135;
  auVar92._8_4_ = uVar135;
  auVar92._12_4_ = uVar135;
  auVar92._16_4_ = uVar135;
  auVar92._20_4_ = uVar135;
  auVar92._24_4_ = uVar135;
  auVar92._28_4_ = uVar135;
  auVar91 = vmaxps_avx512vl(auVar91,auVar92);
  auVar94 = vmaxps_avx(auVar94,auVar91);
  auVar91._8_4_ = 0x3f7ffffa;
  auVar91._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar91._12_4_ = 0x3f7ffffa;
  auVar91._16_4_ = 0x3f7ffffa;
  auVar91._20_4_ = 0x3f7ffffa;
  auVar91._24_4_ = 0x3f7ffffa;
  auVar91._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar94,auVar91);
  auVar94 = vpmaxsd_avx2(auVar104,auVar150);
  auVar91 = vpmaxsd_avx2(auVar103,auVar144);
  auVar94 = vminps_avx(auVar94,auVar91);
  auVar91 = vpmaxsd_avx2(auVar97,auVar102);
  fVar163 = ray->tfar;
  auVar93._4_4_ = fVar163;
  auVar93._0_4_ = fVar163;
  auVar93._8_4_ = fVar163;
  auVar93._12_4_ = fVar163;
  auVar93._16_4_ = fVar163;
  auVar93._20_4_ = fVar163;
  auVar93._24_4_ = fVar163;
  auVar93._28_4_ = fVar163;
  auVar91 = vminps_avx512vl(auVar91,auVar93);
  auVar94 = vminps_avx(auVar94,auVar91);
  auVar96._8_4_ = 0x3f800003;
  auVar96._0_8_ = 0x3f8000033f800003;
  auVar96._12_4_ = 0x3f800003;
  auVar96._16_4_ = 0x3f800003;
  auVar96._20_4_ = 0x3f800003;
  auVar96._24_4_ = 0x3f800003;
  auVar96._28_4_ = 0x3f800003;
  auVar94 = vmulps_avx512vl(auVar94,auVar96);
  uVar23 = vpcmpgtd_avx512vl(auVar95,_DAT_01fe9900);
  uVar141 = vcmpps_avx512vl(local_80,auVar94,2);
  if ((byte)((byte)uVar141 & (byte)uVar23) == 0) {
    bVar77 = false;
  }
  else {
    uVar78 = (ulong)(byte)((byte)uVar141 & (byte)uVar23);
    local_540 = prim;
    do {
      lVar24 = 0;
      for (uVar73 = uVar78; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      uVar78 = uVar78 - 1 & uVar78;
      local_52c = *(undefined4 *)(local_540 + lVar24 * 4 + 6);
      uVar73 = (ulong)(uint)((int)lVar24 << 6);
      local_528 = (ulong)*(uint *)(local_540 + 2);
      pGVar15 = (context->scene->geometries).items[*(uint *)(local_540 + 2)].ptr;
      local_470 = *(undefined1 (*) [16])(prim + uVar73 + lVar70 + 0x16);
      if (uVar78 != 0) {
        uVar74 = uVar78 - 1 & uVar78;
        for (uVar75 = uVar78; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
        }
        if (uVar74 != 0) {
          for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_480 = *(undefined1 (*) [16])(prim + uVar73 + lVar70 + 0x26);
      local_490 = *(undefined1 (*) [16])(prim + uVar73 + lVar70 + 0x36);
      _local_310 = *(undefined1 (*) [16])(prim + uVar73 + lVar70 + 0x46);
      iVar14 = (int)pGVar15[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar3 = (ray->org).field_0;
      auVar82 = vsubps_avx(local_470,(undefined1  [16])aVar3);
      uVar135 = auVar82._0_4_;
      auVar142._4_4_ = uVar135;
      auVar142._0_4_ = uVar135;
      auVar142._8_4_ = uVar135;
      auVar142._12_4_ = uVar135;
      auVar83 = vshufps_avx(auVar82,auVar82,0x55);
      auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
      aVar4 = (pre->ray_space).vx.field_0;
      aVar5 = (pre->ray_space).vy.field_0;
      fVar163 = (pre->ray_space).vz.field_0.m128[0];
      fVar134 = (pre->ray_space).vz.field_0.m128[1];
      fVar138 = (pre->ray_space).vz.field_0.m128[2];
      fVar139 = (pre->ray_space).vz.field_0.m128[3];
      auVar168._0_4_ = auVar82._0_4_ * fVar163;
      auVar168._4_4_ = auVar82._4_4_ * fVar134;
      auVar168._8_4_ = auVar82._8_4_ * fVar138;
      auVar168._12_4_ = auVar82._12_4_ * fVar139;
      auVar83 = vfmadd231ps_fma(auVar168,(undefined1  [16])aVar5,auVar83);
      auVar87 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar4,auVar142);
      auVar82 = vsubps_avx(local_480,(undefined1  [16])aVar3);
      uVar135 = auVar82._0_4_;
      auVar84._4_4_ = uVar135;
      auVar84._0_4_ = uVar135;
      auVar84._8_4_ = uVar135;
      auVar84._12_4_ = uVar135;
      auVar83 = vshufps_avx(auVar82,auVar82,0x55);
      auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
      auVar169._0_4_ = auVar82._0_4_ * fVar163;
      auVar169._4_4_ = auVar82._4_4_ * fVar134;
      auVar169._8_4_ = auVar82._8_4_ * fVar138;
      auVar169._12_4_ = auVar82._12_4_ * fVar139;
      auVar83 = vfmadd231ps_fma(auVar169,(undefined1  [16])aVar5,auVar83);
      auVar179 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar4,auVar84);
      auVar82 = vsubps_avx512vl(local_490,(undefined1  [16])aVar3);
      uVar135 = auVar82._0_4_;
      auVar85._4_4_ = uVar135;
      auVar85._0_4_ = uVar135;
      auVar85._8_4_ = uVar135;
      auVar85._12_4_ = uVar135;
      auVar83 = vshufps_avx(auVar82,auVar82,0x55);
      auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
      auVar86._0_4_ = auVar82._0_4_ * fVar163;
      auVar86._4_4_ = auVar82._4_4_ * fVar134;
      auVar86._8_4_ = auVar82._8_4_ * fVar138;
      auVar86._12_4_ = auVar82._12_4_ * fVar139;
      auVar83 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar5,auVar83);
      auVar8 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar4,auVar85);
      local_2e0 = ZEXT1632((undefined1  [16])aVar3);
      auVar82 = vsubps_avx512vl(_local_310,(undefined1  [16])aVar3);
      uVar135 = auVar82._0_4_;
      auVar143._4_4_ = uVar135;
      auVar143._0_4_ = uVar135;
      auVar143._8_4_ = uVar135;
      auVar143._12_4_ = uVar135;
      auVar83 = vshufps_avx(auVar82,auVar82,0x55);
      auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
      auVar171._0_4_ = auVar82._0_4_ * fVar163;
      auVar171._4_4_ = auVar82._4_4_ * fVar134;
      auVar171._8_4_ = auVar82._8_4_ * fVar138;
      auVar171._12_4_ = auVar82._12_4_ * fVar139;
      auVar83 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar5,auVar83);
      auVar9 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar4,auVar143);
      lVar24 = (long)iVar14 * 0x44;
      auVar94 = *(undefined1 (*) [32])(bspline_basis0 + lVar24);
      local_340 = vbroadcastss_avx512vl(auVar87);
      auVar136._8_4_ = 1;
      auVar136._0_8_ = 0x100000001;
      auVar136._12_4_ = 1;
      auVar136._16_4_ = 1;
      auVar136._20_4_ = 1;
      auVar136._24_4_ = 1;
      auVar136._28_4_ = 1;
      local_360 = vpermps_avx2(auVar136,ZEXT1632(auVar87));
      auVar91 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x484);
      uVar135 = auVar179._0_4_;
      local_3e0._4_4_ = uVar135;
      local_3e0._0_4_ = uVar135;
      local_3e0._8_4_ = uVar135;
      local_3e0._12_4_ = uVar135;
      local_3e0._16_4_ = uVar135;
      local_3e0._20_4_ = uVar135;
      local_3e0._24_4_ = uVar135;
      local_3e0._28_4_ = uVar135;
      auVar92 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x908);
      local_380 = vpermps_avx2(auVar136,ZEXT1632(auVar179));
      local_400 = vbroadcastss_avx512vl(auVar8);
      local_420 = vpermps_avx512vl(auVar136,ZEXT1632(auVar8));
      auVar93 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0xd8c);
      fVar163 = auVar9._0_4_;
      local_3a0._4_4_ = fVar163;
      local_3a0._0_4_ = fVar163;
      local_3a0._8_4_ = fVar163;
      local_3a0._12_4_ = fVar163;
      local_3a0._16_4_ = fVar163;
      local_3a0._20_4_ = fVar163;
      local_3a0._24_4_ = fVar163;
      local_3a0._28_4_ = fVar163;
      local_440 = vpermps_avx512vl(auVar136,ZEXT1632(auVar9));
      auVar96 = vmulps_avx512vl(local_3a0,auVar93);
      auVar95 = vmulps_avx512vl(local_440,auVar93);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar92,local_400);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar92,local_420);
      auVar83 = vfmadd231ps_fma(auVar96,auVar91,local_3e0);
      auVar82 = vfmadd231ps_fma(auVar95,auVar91,local_380);
      auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar94,local_340);
      auVar96 = *(undefined1 (*) [32])(bspline_basis1 + lVar24);
      auVar95 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x484);
      auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar94,local_360);
      auVar104 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x908);
      auVar103 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0xd8c);
      auVar90 = vmulps_avx512vl(local_3a0,auVar103);
      auVar99 = vmulps_avx512vl(local_440,auVar103);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar104,local_400);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar104,local_420);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar95,local_3e0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar95,local_380);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar96,local_340);
      auVar10 = vfmadd231ps_fma(auVar99,auVar96,local_360);
      auVar99 = vsubps_avx512vl(auVar90,auVar97);
      auVar100 = vsubps_avx512vl(ZEXT1632(auVar10),auVar98);
      auVar88 = vmulps_avx512vl(auVar98,auVar99);
      auVar89 = vmulps_avx512vl(auVar97,auVar100);
      auVar88 = vsubps_avx512vl(auVar88,auVar89);
      auVar83 = vshufps_avx(local_470,local_470,0xff);
      uVar141 = auVar83._0_8_;
      local_a0._8_8_ = uVar141;
      local_a0._0_8_ = uVar141;
      local_a0._16_8_ = uVar141;
      local_a0._24_8_ = uVar141;
      auVar83 = vshufps_avx(local_480,local_480,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar83);
      auVar83 = vshufps_avx512vl(local_490,local_490,0xff);
      local_e0 = vbroadcastsd_avx512vl(auVar83);
      auVar83 = vshufps_avx512vl(_local_310,_local_310,0xff);
      uVar141 = auVar83._0_8_;
      register0x000012c8 = uVar141;
      local_100 = uVar141;
      register0x000012d0 = uVar141;
      register0x000012d8 = uVar141;
      auVar89 = vmulps_avx512vl(_local_100,auVar93);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar92,local_e0);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar91,local_c0);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar94,local_a0);
      auVar101 = vmulps_avx512vl(_local_100,auVar103);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar104,local_e0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar95,local_c0);
      auVar11 = vfmadd231ps_fma(auVar101,auVar96,local_a0);
      auVar101 = vmulps_avx512vl(auVar100,auVar100);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar99,auVar99);
      auVar102 = vmaxps_avx512vl(auVar89,ZEXT1632(auVar11));
      auVar102 = vmulps_avx512vl(auVar102,auVar102);
      auVar101 = vmulps_avx512vl(auVar102,auVar101);
      auVar88 = vmulps_avx512vl(auVar88,auVar88);
      uVar141 = vcmpps_avx512vl(auVar88,auVar101,2);
      auVar83 = vblendps_avx(auVar87,local_470,8);
      auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar82 = vandps_avx512vl(auVar83,auVar84);
      auVar142 = local_480;
      auVar83 = vblendps_avx(auVar179,local_480,8);
      auVar83 = vandps_avx512vl(auVar83,auVar84);
      auVar82 = vmaxps_avx(auVar82,auVar83);
      auVar12 = local_490;
      auVar83 = vblendps_avx(auVar8,local_490,8);
      auVar85 = vandps_avx512vl(auVar83,auVar84);
      auVar83 = vblendps_avx(auVar9,_local_310,8);
      auVar83 = vandps_avx512vl(auVar83,auVar84);
      auVar83 = vmaxps_avx(auVar85,auVar83);
      auVar83 = vmaxps_avx(auVar82,auVar83);
      auVar82 = vmovshdup_avx(auVar83);
      auVar82 = vmaxss_avx(auVar82,auVar83);
      auVar83 = vshufpd_avx(auVar83,auVar83,1);
      auVar83 = vmaxss_avx(auVar83,auVar82);
      _local_300 = vcvtsi2ss_avx512f(_local_310,iVar14);
      auVar172._0_4_ = local_300._0_4_;
      auVar172._4_4_ = auVar172._0_4_;
      auVar172._8_4_ = auVar172._0_4_;
      auVar172._12_4_ = auVar172._0_4_;
      auVar172._16_4_ = auVar172._0_4_;
      auVar172._20_4_ = auVar172._0_4_;
      auVar172._24_4_ = auVar172._0_4_;
      auVar172._28_4_ = auVar172._0_4_;
      uVar23 = vcmpps_avx512vl(auVar172,_DAT_01faff40,0xe);
      bVar79 = (byte)uVar141 & (byte)uVar23;
      auVar151._8_4_ = 2;
      auVar151._0_8_ = 0x200000002;
      auVar151._12_4_ = 2;
      auVar151._16_4_ = 2;
      auVar151._20_4_ = 2;
      auVar151._24_4_ = 2;
      auVar151._28_4_ = 2;
      local_3c0 = vpermps_avx512vl(auVar151,ZEXT1632(auVar87));
      auVar182 = ZEXT3264(local_3c0);
      local_120 = vpermps_avx512vl(auVar151,ZEXT1632(auVar179));
      local_140 = vpermps_avx512vl(auVar151,ZEXT1632(auVar8));
      local_460 = vpermps_avx2(auVar151,ZEXT1632(auVar9));
      auVar82 = auVar103._0_16_;
      auVar83 = ZEXT416((uint)(auVar83._0_4_ * 4.7683716e-07));
      local_548 = ray;
      if (bVar79 == 0) {
        bVar77 = false;
        auVar82 = vxorps_avx512vl(auVar82,auVar82);
        auVar180 = ZEXT1664(auVar82);
        auVar178 = ZEXT3264(local_340);
        auVar184 = ZEXT3264(local_360);
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar181 = ZEXT3264(auVar94);
        auVar187 = ZEXT3264(local_3e0);
        auVar183 = ZEXT3264(local_380);
        auVar189 = ZEXT3264(local_400);
        auVar186 = ZEXT3264(local_420);
        auVar185 = ZEXT3264(local_3a0);
        auVar188 = ZEXT3264(local_440);
        local_490 = auVar12;
        local_480 = auVar142;
      }
      else {
        auVar103 = vmulps_avx512vl(local_460,auVar103);
        auVar104 = vfmadd213ps_avx512vl(auVar104,local_140,auVar103);
        auVar95 = vfmadd213ps_avx512vl(auVar95,local_120,auVar104);
        auVar95 = vfmadd213ps_avx512vl(auVar96,local_3c0,auVar95);
        auVar93 = vmulps_avx512vl(local_460,auVar93);
        auVar92 = vfmadd213ps_avx512vl(auVar92,local_140,auVar93);
        auVar104 = vfmadd213ps_avx512vl(auVar91,local_120,auVar92);
        auVar91 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1210);
        auVar92 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1694);
        auVar93 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1b18);
        auVar96 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1f9c);
        auVar104 = vfmadd213ps_avx512vl(auVar94,local_3c0,auVar104);
        auVar94 = vmulps_avx512vl(local_3a0,auVar96);
        auVar103 = vmulps_avx512vl(local_440,auVar96);
        auVar96 = vmulps_avx512vl(local_460,auVar96);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar93,local_400);
        auVar186 = ZEXT3264(local_420);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar93,local_420);
        auVar93 = vfmadd231ps_avx512vl(auVar96,local_140,auVar93);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar92,local_3e0);
        auVar96 = vfmadd231ps_avx512vl(auVar103,auVar92,local_380);
        auVar103 = vfmadd231ps_avx512vl(auVar93,local_120,auVar92);
        auVar87 = vfmadd231ps_fma(auVar94,auVar91,local_340);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar91,local_360);
        auVar94 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1210);
        auVar92 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1b18);
        auVar93 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1f9c);
        auVar103 = vfmadd231ps_avx512vl(auVar103,local_3c0,auVar91);
        auVar35._4_4_ = fVar163 * auVar93._4_4_;
        auVar35._0_4_ = fVar163 * auVar93._0_4_;
        auVar35._8_4_ = fVar163 * auVar93._8_4_;
        auVar35._12_4_ = fVar163 * auVar93._12_4_;
        auVar35._16_4_ = fVar163 * auVar93._16_4_;
        auVar35._20_4_ = fVar163 * auVar93._20_4_;
        auVar35._24_4_ = fVar163 * auVar93._24_4_;
        auVar35._28_4_ = auVar91._28_4_;
        auVar91 = vmulps_avx512vl(local_440,auVar93);
        auVar93 = vmulps_avx512vl(local_460,auVar93);
        auVar182 = ZEXT3264(local_3c0);
        auVar88 = vfmadd231ps_avx512vl(auVar35,auVar92,local_400);
        auVar101 = vfmadd231ps_avx512vl(auVar91,auVar92,local_420);
        auVar92 = vfmadd231ps_avx512vl(auVar93,local_140,auVar92);
        auVar91 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1694);
        auVar93 = vfmadd231ps_avx512vl(auVar88,auVar91,local_3e0);
        auVar88 = vfmadd231ps_avx512vl(auVar101,auVar91,local_380);
        auVar91 = vfmadd231ps_avx512vl(auVar92,local_120,auVar91);
        auVar179 = vfmadd231ps_fma(auVar93,auVar94,local_340);
        auVar92 = vfmadd231ps_avx512vl(auVar88,auVar94,local_360);
        auVar93 = vfmadd231ps_avx512vl(auVar91,local_3c0,auVar94);
        auVar176._8_4_ = 0x7fffffff;
        auVar176._0_8_ = 0x7fffffff7fffffff;
        auVar176._12_4_ = 0x7fffffff;
        auVar176._16_4_ = 0x7fffffff;
        auVar176._20_4_ = 0x7fffffff;
        auVar176._24_4_ = 0x7fffffff;
        auVar176._28_4_ = 0x7fffffff;
        auVar94 = vandps_avx(ZEXT1632(auVar87),auVar176);
        auVar91 = vandps_avx(auVar96,auVar176);
        auVar91 = vmaxps_avx(auVar94,auVar91);
        auVar94 = vandps_avx(auVar103,auVar176);
        auVar94 = vmaxps_avx(auVar91,auVar94);
        auVar103 = vbroadcastss_avx512vl(auVar83);
        uVar73 = vcmpps_avx512vl(auVar94,auVar103,1);
        bVar77 = (bool)((byte)uVar73 & 1);
        auVar105._0_4_ = (float)((uint)bVar77 * auVar99._0_4_ | (uint)!bVar77 * auVar87._0_4_);
        bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar77 * auVar99._4_4_ | (uint)!bVar77 * auVar87._4_4_);
        bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar77 * auVar99._8_4_ | (uint)!bVar77 * auVar87._8_4_);
        bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar77 * auVar99._12_4_ | (uint)!bVar77 * auVar87._12_4_);
        fVar163 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar99._16_4_);
        auVar105._16_4_ = fVar163;
        fVar134 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar99._20_4_);
        auVar105._20_4_ = fVar134;
        fVar138 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar99._24_4_);
        auVar105._24_4_ = fVar138;
        uVar72 = (uint)(byte)(uVar73 >> 7) * auVar99._28_4_;
        auVar105._28_4_ = uVar72;
        bVar77 = (bool)((byte)uVar73 & 1);
        auVar106._0_4_ = (float)((uint)bVar77 * auVar100._0_4_ | (uint)!bVar77 * auVar96._0_4_);
        bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar77 * auVar100._4_4_ | (uint)!bVar77 * auVar96._4_4_);
        bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar77 * auVar100._8_4_ | (uint)!bVar77 * auVar96._8_4_);
        bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar77 * auVar100._12_4_ | (uint)!bVar77 * auVar96._12_4_);
        bVar77 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar106._16_4_ = (float)((uint)bVar77 * auVar100._16_4_ | (uint)!bVar77 * auVar96._16_4_);
        bVar77 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar106._20_4_ = (float)((uint)bVar77 * auVar100._20_4_ | (uint)!bVar77 * auVar96._20_4_);
        bVar77 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar106._24_4_ = (float)((uint)bVar77 * auVar100._24_4_ | (uint)!bVar77 * auVar96._24_4_);
        bVar77 = SUB81(uVar73 >> 7,0);
        auVar106._28_4_ = (uint)bVar77 * auVar100._28_4_ | (uint)!bVar77 * auVar96._28_4_;
        auVar94 = vandps_avx(auVar176,ZEXT1632(auVar179));
        auVar91 = vandps_avx(auVar92,auVar176);
        auVar91 = vmaxps_avx(auVar94,auVar91);
        auVar94 = vandps_avx(auVar93,auVar176);
        auVar94 = vmaxps_avx(auVar91,auVar94);
        uVar73 = vcmpps_avx512vl(auVar94,auVar103,1);
        bVar77 = (bool)((byte)uVar73 & 1);
        auVar107._0_4_ = (float)((uint)bVar77 * auVar99._0_4_ | (uint)!bVar77 * auVar179._0_4_);
        bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar77 * auVar99._4_4_ | (uint)!bVar77 * auVar179._4_4_);
        bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar77 * auVar99._8_4_ | (uint)!bVar77 * auVar179._8_4_);
        bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar77 * auVar99._12_4_ | (uint)!bVar77 * auVar179._12_4_);
        fVar139 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar99._16_4_);
        auVar107._16_4_ = fVar139;
        fVar140 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar99._20_4_);
        auVar107._20_4_ = fVar140;
        fVar165 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar99._24_4_);
        auVar107._24_4_ = fVar165;
        auVar107._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar99._28_4_;
        bVar77 = (bool)((byte)uVar73 & 1);
        auVar108._0_4_ = (float)((uint)bVar77 * auVar100._0_4_ | (uint)!bVar77 * auVar92._0_4_);
        bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar77 * auVar100._4_4_ | (uint)!bVar77 * auVar92._4_4_);
        bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar77 * auVar100._8_4_ | (uint)!bVar77 * auVar92._8_4_);
        bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar77 * auVar100._12_4_ | (uint)!bVar77 * auVar92._12_4_);
        bVar77 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar108._16_4_ = (float)((uint)bVar77 * auVar100._16_4_ | (uint)!bVar77 * auVar92._16_4_);
        bVar77 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar108._20_4_ = (float)((uint)bVar77 * auVar100._20_4_ | (uint)!bVar77 * auVar92._20_4_);
        bVar77 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar108._24_4_ = (float)((uint)bVar77 * auVar100._24_4_ | (uint)!bVar77 * auVar92._24_4_);
        bVar77 = SUB81(uVar73 >> 7,0);
        auVar108._28_4_ = (uint)bVar77 * auVar100._28_4_ | (uint)!bVar77 * auVar92._28_4_;
        auVar86 = vxorps_avx512vl(auVar82,auVar82);
        auVar180 = ZEXT1664(auVar86);
        auVar94 = vfmadd213ps_avx512vl(auVar105,auVar105,ZEXT1632(auVar86));
        auVar82 = vfmadd231ps_fma(auVar94,auVar106,auVar106);
        auVar94 = vrsqrt14ps_avx512vl(ZEXT1632(auVar82));
        fVar80 = auVar94._0_4_;
        fVar81 = auVar94._4_4_;
        fVar152 = auVar94._8_4_;
        fVar126 = auVar94._12_4_;
        fVar127 = auVar94._16_4_;
        fVar128 = auVar94._20_4_;
        fVar130 = auVar94._24_4_;
        auVar36._4_4_ = fVar81 * fVar81 * fVar81 * auVar82._4_4_ * -0.5;
        auVar36._0_4_ = fVar80 * fVar80 * fVar80 * auVar82._0_4_ * -0.5;
        auVar36._8_4_ = fVar152 * fVar152 * fVar152 * auVar82._8_4_ * -0.5;
        auVar36._12_4_ = fVar126 * fVar126 * fVar126 * auVar82._12_4_ * -0.5;
        auVar36._16_4_ = fVar127 * fVar127 * fVar127 * -0.0;
        auVar36._20_4_ = fVar128 * fVar128 * fVar128 * -0.0;
        auVar36._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
        auVar36._28_4_ = 0;
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar92 = vfmadd231ps_avx512vl(auVar36,auVar91,auVar94);
        auVar37._4_4_ = auVar106._4_4_ * auVar92._4_4_;
        auVar37._0_4_ = auVar106._0_4_ * auVar92._0_4_;
        auVar37._8_4_ = auVar106._8_4_ * auVar92._8_4_;
        auVar37._12_4_ = auVar106._12_4_ * auVar92._12_4_;
        auVar37._16_4_ = auVar106._16_4_ * auVar92._16_4_;
        auVar37._20_4_ = auVar106._20_4_ * auVar92._20_4_;
        auVar37._24_4_ = auVar106._24_4_ * auVar92._24_4_;
        auVar37._28_4_ = auVar94._28_4_;
        auVar38._4_4_ = auVar92._4_4_ * -auVar105._4_4_;
        auVar38._0_4_ = auVar92._0_4_ * -auVar105._0_4_;
        auVar38._8_4_ = auVar92._8_4_ * -auVar105._8_4_;
        auVar38._12_4_ = auVar92._12_4_ * -auVar105._12_4_;
        auVar38._16_4_ = auVar92._16_4_ * -fVar163;
        auVar38._20_4_ = auVar92._20_4_ * -fVar134;
        auVar38._24_4_ = auVar92._24_4_ * -fVar138;
        auVar38._28_4_ = uVar72 ^ 0x80000000;
        auVar94 = vmulps_avx512vl(auVar92,ZEXT1632(auVar86));
        auVar99 = ZEXT1632(auVar86);
        auVar93 = vfmadd213ps_avx512vl(auVar107,auVar107,auVar99);
        auVar82 = vfmadd231ps_fma(auVar93,auVar108,auVar108);
        auVar93 = vrsqrt14ps_avx512vl(ZEXT1632(auVar82));
        fVar163 = auVar93._0_4_;
        fVar134 = auVar93._4_4_;
        fVar138 = auVar93._8_4_;
        fVar80 = auVar93._12_4_;
        fVar81 = auVar93._16_4_;
        fVar152 = auVar93._20_4_;
        fVar126 = auVar93._24_4_;
        auVar39._4_4_ = fVar134 * fVar134 * fVar134 * auVar82._4_4_ * -0.5;
        auVar39._0_4_ = fVar163 * fVar163 * fVar163 * auVar82._0_4_ * -0.5;
        auVar39._8_4_ = fVar138 * fVar138 * fVar138 * auVar82._8_4_ * -0.5;
        auVar39._12_4_ = fVar80 * fVar80 * fVar80 * auVar82._12_4_ * -0.5;
        auVar39._16_4_ = fVar81 * fVar81 * fVar81 * -0.0;
        auVar39._20_4_ = fVar152 * fVar152 * fVar152 * -0.0;
        auVar39._24_4_ = fVar126 * fVar126 * fVar126 * -0.0;
        auVar39._28_4_ = 0;
        auVar91 = vfmadd231ps_avx512vl(auVar39,auVar91,auVar93);
        auVar40._4_4_ = auVar108._4_4_ * auVar91._4_4_;
        auVar40._0_4_ = auVar108._0_4_ * auVar91._0_4_;
        auVar40._8_4_ = auVar108._8_4_ * auVar91._8_4_;
        auVar40._12_4_ = auVar108._12_4_ * auVar91._12_4_;
        auVar40._16_4_ = auVar108._16_4_ * auVar91._16_4_;
        auVar40._20_4_ = auVar108._20_4_ * auVar91._20_4_;
        auVar40._24_4_ = auVar108._24_4_ * auVar91._24_4_;
        auVar40._28_4_ = auVar93._28_4_;
        auVar41._4_4_ = -auVar107._4_4_ * auVar91._4_4_;
        auVar41._0_4_ = -auVar107._0_4_ * auVar91._0_4_;
        auVar41._8_4_ = -auVar107._8_4_ * auVar91._8_4_;
        auVar41._12_4_ = -auVar107._12_4_ * auVar91._12_4_;
        auVar41._16_4_ = -fVar139 * auVar91._16_4_;
        auVar41._20_4_ = -fVar140 * auVar91._20_4_;
        auVar41._24_4_ = -fVar165 * auVar91._24_4_;
        auVar41._28_4_ = auVar92._28_4_;
        auVar91 = vmulps_avx512vl(auVar91,auVar99);
        auVar82 = vfmadd213ps_fma(auVar37,auVar89,auVar97);
        auVar87 = vfmadd213ps_fma(auVar38,auVar89,auVar98);
        auVar92 = vfmadd213ps_avx512vl(auVar94,auVar89,auVar104);
        auVar93 = vfmadd213ps_avx512vl(auVar40,ZEXT1632(auVar11),auVar90);
        auVar84 = vfnmadd213ps_fma(auVar37,auVar89,auVar97);
        auVar103 = ZEXT1632(auVar11);
        auVar179 = vfmadd213ps_fma(auVar41,auVar103,ZEXT1632(auVar10));
        auVar85 = vfnmadd213ps_fma(auVar38,auVar89,auVar98);
        auVar8 = vfmadd213ps_fma(auVar91,auVar103,auVar95);
        auVar96 = vfnmadd231ps_avx512vl(auVar104,auVar89,auVar94);
        auVar143 = vfnmadd213ps_fma(auVar40,auVar103,auVar90);
        auVar168 = vfnmadd213ps_fma(auVar41,auVar103,ZEXT1632(auVar10));
        auVar169 = vfnmadd231ps_fma(auVar95,ZEXT1632(auVar11),auVar91);
        auVar91 = vsubps_avx512vl(auVar93,ZEXT1632(auVar84));
        auVar94 = vsubps_avx(ZEXT1632(auVar179),ZEXT1632(auVar85));
        auVar95 = vsubps_avx512vl(ZEXT1632(auVar8),auVar96);
        auVar104 = vmulps_avx512vl(auVar94,auVar96);
        auVar9 = vfmsub231ps_fma(auVar104,ZEXT1632(auVar85),auVar95);
        auVar42._4_4_ = auVar84._4_4_ * auVar95._4_4_;
        auVar42._0_4_ = auVar84._0_4_ * auVar95._0_4_;
        auVar42._8_4_ = auVar84._8_4_ * auVar95._8_4_;
        auVar42._12_4_ = auVar84._12_4_ * auVar95._12_4_;
        auVar42._16_4_ = auVar95._16_4_ * 0.0;
        auVar42._20_4_ = auVar95._20_4_ * 0.0;
        auVar42._24_4_ = auVar95._24_4_ * 0.0;
        auVar42._28_4_ = auVar95._28_4_;
        auVar95 = vfmsub231ps_avx512vl(auVar42,auVar96,auVar91);
        auVar43._4_4_ = auVar85._4_4_ * auVar91._4_4_;
        auVar43._0_4_ = auVar85._0_4_ * auVar91._0_4_;
        auVar43._8_4_ = auVar85._8_4_ * auVar91._8_4_;
        auVar43._12_4_ = auVar85._12_4_ * auVar91._12_4_;
        auVar43._16_4_ = auVar91._16_4_ * 0.0;
        auVar43._20_4_ = auVar91._20_4_ * 0.0;
        auVar43._24_4_ = auVar91._24_4_ * 0.0;
        auVar43._28_4_ = auVar91._28_4_;
        auVar10 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar84),auVar94);
        auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar99,auVar95);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar99,ZEXT1632(auVar9));
        auVar100 = ZEXT1632(auVar86);
        uVar73 = vcmpps_avx512vl(auVar94,auVar100,2);
        bVar71 = (byte)uVar73;
        fVar80 = (float)((uint)(bVar71 & 1) * auVar82._0_4_ |
                        (uint)!(bool)(bVar71 & 1) * auVar143._0_4_);
        bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
        fVar152 = (float)((uint)bVar77 * auVar82._4_4_ | (uint)!bVar77 * auVar143._4_4_);
        bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
        fVar127 = (float)((uint)bVar77 * auVar82._8_4_ | (uint)!bVar77 * auVar143._8_4_);
        bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
        fVar130 = (float)((uint)bVar77 * auVar82._12_4_ | (uint)!bVar77 * auVar143._12_4_);
        auVar104 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar127,CONCAT44(fVar152,fVar80))));
        fVar81 = (float)((uint)(bVar71 & 1) * auVar87._0_4_ |
                        (uint)!(bool)(bVar71 & 1) * auVar168._0_4_);
        bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
        fVar126 = (float)((uint)bVar77 * auVar87._4_4_ | (uint)!bVar77 * auVar168._4_4_);
        bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
        fVar128 = (float)((uint)bVar77 * auVar87._8_4_ | (uint)!bVar77 * auVar168._8_4_);
        bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
        fVar131 = (float)((uint)bVar77 * auVar87._12_4_ | (uint)!bVar77 * auVar168._12_4_);
        auVar103 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar128,CONCAT44(fVar126,fVar81))));
        auVar109._0_4_ =
             (float)((uint)(bVar71 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar169._0_4_
                    );
        bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar77 * auVar92._4_4_ | (uint)!bVar77 * auVar169._4_4_);
        bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar77 * auVar92._8_4_ | (uint)!bVar77 * auVar169._8_4_);
        bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar77 * auVar92._12_4_ | (uint)!bVar77 * auVar169._12_4_);
        fVar134 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar92._16_4_);
        auVar109._16_4_ = fVar134;
        fVar163 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar92._20_4_);
        auVar109._20_4_ = fVar163;
        fVar138 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar92._24_4_);
        auVar109._24_4_ = fVar138;
        iVar1 = (uint)(byte)(uVar73 >> 7) * auVar92._28_4_;
        auVar109._28_4_ = iVar1;
        auVar91 = vblendmps_avx512vl(ZEXT1632(auVar84),auVar93);
        auVar110._0_4_ =
             (uint)(bVar71 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar9._0_4_;
        bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar110._4_4_ = (uint)bVar77 * auVar91._4_4_ | (uint)!bVar77 * auVar9._4_4_;
        bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar110._8_4_ = (uint)bVar77 * auVar91._8_4_ | (uint)!bVar77 * auVar9._8_4_;
        bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar110._12_4_ = (uint)bVar77 * auVar91._12_4_ | (uint)!bVar77 * auVar9._12_4_;
        auVar110._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar91._16_4_;
        auVar110._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar91._20_4_;
        auVar110._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar91._24_4_;
        auVar110._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar91._28_4_;
        auVar91 = vblendmps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar179));
        auVar111._0_4_ =
             (float)((uint)(bVar71 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar87._0_4_)
        ;
        bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar77 * auVar91._4_4_ | (uint)!bVar77 * auVar87._4_4_);
        bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar77 * auVar91._8_4_ | (uint)!bVar77 * auVar87._8_4_);
        bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar77 * auVar91._12_4_ | (uint)!bVar77 * auVar87._12_4_);
        fVar140 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar91._16_4_);
        auVar111._16_4_ = fVar140;
        fVar165 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar91._20_4_);
        auVar111._20_4_ = fVar165;
        fVar139 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar91._24_4_);
        auVar111._24_4_ = fVar139;
        auVar111._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar91._28_4_;
        auVar91 = vblendmps_avx512vl(auVar96,ZEXT1632(auVar8));
        auVar112._0_4_ =
             (float)((uint)(bVar71 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar92._0_4_)
        ;
        bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar77 * auVar91._4_4_ | (uint)!bVar77 * auVar92._4_4_);
        bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar77 * auVar91._8_4_ | (uint)!bVar77 * auVar92._8_4_);
        bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar77 * auVar91._12_4_ | (uint)!bVar77 * auVar92._12_4_);
        bVar77 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar112._16_4_ = (float)((uint)bVar77 * auVar91._16_4_ | (uint)!bVar77 * auVar92._16_4_);
        bVar77 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar112._20_4_ = (float)((uint)bVar77 * auVar91._20_4_ | (uint)!bVar77 * auVar92._20_4_);
        bVar77 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar112._24_4_ = (float)((uint)bVar77 * auVar91._24_4_ | (uint)!bVar77 * auVar92._24_4_);
        bVar77 = SUB81(uVar73 >> 7,0);
        auVar112._28_4_ = (uint)bVar77 * auVar91._28_4_ | (uint)!bVar77 * auVar92._28_4_;
        auVar113._0_4_ =
             (uint)(bVar71 & 1) * (int)auVar84._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar93._0_4_;
        bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar113._4_4_ = (uint)bVar77 * (int)auVar84._4_4_ | (uint)!bVar77 * auVar93._4_4_;
        bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar113._8_4_ = (uint)bVar77 * (int)auVar84._8_4_ | (uint)!bVar77 * auVar93._8_4_;
        bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar113._12_4_ = (uint)bVar77 * (int)auVar84._12_4_ | (uint)!bVar77 * auVar93._12_4_;
        auVar113._16_4_ = (uint)!(bool)((byte)(uVar73 >> 4) & 1) * auVar93._16_4_;
        auVar113._20_4_ = (uint)!(bool)((byte)(uVar73 >> 5) & 1) * auVar93._20_4_;
        auVar113._24_4_ = (uint)!(bool)((byte)(uVar73 >> 6) & 1) * auVar93._24_4_;
        auVar113._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar93._28_4_;
        bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar73 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar114._0_4_ =
             (uint)(bVar71 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar8._0_4_;
        bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar114._4_4_ = (uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * auVar8._4_4_;
        bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar114._8_4_ = (uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * auVar8._8_4_;
        bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar114._12_4_ = (uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * auVar8._12_4_;
        auVar114._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar96._16_4_;
        auVar114._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar96._20_4_;
        auVar114._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar96._24_4_;
        iVar2 = (uint)(byte)(uVar73 >> 7) * auVar96._28_4_;
        auVar114._28_4_ = iVar2;
        auVar97 = vsubps_avx512vl(auVar113,auVar104);
        auVar91 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar85._12_4_ |
                                                (uint)!bVar20 * auVar179._12_4_,
                                                CONCAT48((uint)bVar18 * (int)auVar85._8_4_ |
                                                         (uint)!bVar18 * auVar179._8_4_,
                                                         CONCAT44((uint)bVar77 * (int)auVar85._4_4_
                                                                  | (uint)!bVar77 * auVar179._4_4_,
                                                                  (uint)(bVar71 & 1) *
                                                                  (int)auVar85._0_4_ |
                                                                  (uint)!(bool)(bVar71 & 1) *
                                                                  auVar179._0_4_)))),auVar103);
        auVar92 = vsubps_avx(auVar114,auVar109);
        auVar93 = vsubps_avx(auVar104,auVar110);
        auVar96 = vsubps_avx(auVar103,auVar111);
        auVar95 = vsubps_avx(auVar109,auVar112);
        auVar44._4_4_ = auVar92._4_4_ * fVar152;
        auVar44._0_4_ = auVar92._0_4_ * fVar80;
        auVar44._8_4_ = auVar92._8_4_ * fVar127;
        auVar44._12_4_ = auVar92._12_4_ * fVar130;
        auVar44._16_4_ = auVar92._16_4_ * 0.0;
        auVar44._20_4_ = auVar92._20_4_ * 0.0;
        auVar44._24_4_ = auVar92._24_4_ * 0.0;
        auVar44._28_4_ = iVar2;
        auVar82 = vfmsub231ps_fma(auVar44,auVar109,auVar97);
        auVar45._4_4_ = fVar126 * auVar97._4_4_;
        auVar45._0_4_ = fVar81 * auVar97._0_4_;
        auVar45._8_4_ = fVar128 * auVar97._8_4_;
        auVar45._12_4_ = fVar131 * auVar97._12_4_;
        auVar45._16_4_ = auVar97._16_4_ * 0.0;
        auVar45._20_4_ = auVar97._20_4_ * 0.0;
        auVar45._24_4_ = auVar97._24_4_ * 0.0;
        auVar45._28_4_ = auVar94._28_4_;
        auVar87 = vfmsub231ps_fma(auVar45,auVar104,auVar91);
        auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar100,ZEXT1632(auVar82));
        auVar159._0_4_ = auVar91._0_4_ * auVar109._0_4_;
        auVar159._4_4_ = auVar91._4_4_ * auVar109._4_4_;
        auVar159._8_4_ = auVar91._8_4_ * auVar109._8_4_;
        auVar159._12_4_ = auVar91._12_4_ * auVar109._12_4_;
        auVar159._16_4_ = auVar91._16_4_ * fVar134;
        auVar159._20_4_ = auVar91._20_4_ * fVar163;
        auVar159._24_4_ = auVar91._24_4_ * fVar138;
        auVar159._28_4_ = 0;
        auVar82 = vfmsub231ps_fma(auVar159,auVar103,auVar92);
        auVar98 = vfmadd231ps_avx512vl(auVar94,auVar100,ZEXT1632(auVar82));
        auVar94 = vmulps_avx512vl(auVar95,auVar110);
        auVar94 = vfmsub231ps_avx512vl(auVar94,auVar93,auVar112);
        auVar46._4_4_ = auVar96._4_4_ * auVar112._4_4_;
        auVar46._0_4_ = auVar96._0_4_ * auVar112._0_4_;
        auVar46._8_4_ = auVar96._8_4_ * auVar112._8_4_;
        auVar46._12_4_ = auVar96._12_4_ * auVar112._12_4_;
        auVar46._16_4_ = auVar96._16_4_ * auVar112._16_4_;
        auVar46._20_4_ = auVar96._20_4_ * auVar112._20_4_;
        auVar46._24_4_ = auVar96._24_4_ * auVar112._24_4_;
        auVar46._28_4_ = auVar112._28_4_;
        auVar82 = vfmsub231ps_fma(auVar46,auVar111,auVar95);
        auVar160._0_4_ = auVar111._0_4_ * auVar93._0_4_;
        auVar160._4_4_ = auVar111._4_4_ * auVar93._4_4_;
        auVar160._8_4_ = auVar111._8_4_ * auVar93._8_4_;
        auVar160._12_4_ = auVar111._12_4_ * auVar93._12_4_;
        auVar160._16_4_ = fVar140 * auVar93._16_4_;
        auVar160._20_4_ = fVar165 * auVar93._20_4_;
        auVar160._24_4_ = fVar139 * auVar93._24_4_;
        auVar160._28_4_ = 0;
        auVar87 = vfmsub231ps_fma(auVar160,auVar96,auVar110);
        auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar100,auVar94);
        auVar90 = vfmadd231ps_avx512vl(auVar94,auVar100,ZEXT1632(auVar82));
        auVar94 = vmaxps_avx(auVar98,auVar90);
        uVar141 = vcmpps_avx512vl(auVar94,auVar100,2);
        bVar79 = bVar79 & (byte)uVar141;
        auVar178 = ZEXT3264(local_340);
        auVar184 = ZEXT3264(local_360);
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar181 = ZEXT3264(auVar99);
        auVar187 = ZEXT3264(local_3e0);
        auVar183 = ZEXT3264(local_380);
        auVar189 = ZEXT3264(local_400);
        auVar185 = ZEXT3264(local_3a0);
        auVar188 = ZEXT3264(local_440);
        if (bVar79 != 0) {
          auVar47._4_4_ = auVar95._4_4_ * auVar91._4_4_;
          auVar47._0_4_ = auVar95._0_4_ * auVar91._0_4_;
          auVar47._8_4_ = auVar95._8_4_ * auVar91._8_4_;
          auVar47._12_4_ = auVar95._12_4_ * auVar91._12_4_;
          auVar47._16_4_ = auVar95._16_4_ * auVar91._16_4_;
          auVar47._20_4_ = auVar95._20_4_ * auVar91._20_4_;
          auVar47._24_4_ = auVar95._24_4_ * auVar91._24_4_;
          auVar47._28_4_ = auVar94._28_4_;
          auVar179 = vfmsub231ps_fma(auVar47,auVar96,auVar92);
          auVar48._4_4_ = auVar92._4_4_ * auVar93._4_4_;
          auVar48._0_4_ = auVar92._0_4_ * auVar93._0_4_;
          auVar48._8_4_ = auVar92._8_4_ * auVar93._8_4_;
          auVar48._12_4_ = auVar92._12_4_ * auVar93._12_4_;
          auVar48._16_4_ = auVar92._16_4_ * auVar93._16_4_;
          auVar48._20_4_ = auVar92._20_4_ * auVar93._20_4_;
          auVar48._24_4_ = auVar92._24_4_ * auVar93._24_4_;
          auVar48._28_4_ = auVar92._28_4_;
          auVar87 = vfmsub231ps_fma(auVar48,auVar97,auVar95);
          auVar49._4_4_ = auVar96._4_4_ * auVar97._4_4_;
          auVar49._0_4_ = auVar96._0_4_ * auVar97._0_4_;
          auVar49._8_4_ = auVar96._8_4_ * auVar97._8_4_;
          auVar49._12_4_ = auVar96._12_4_ * auVar97._12_4_;
          auVar49._16_4_ = auVar96._16_4_ * auVar97._16_4_;
          auVar49._20_4_ = auVar96._20_4_ * auVar97._20_4_;
          auVar49._24_4_ = auVar96._24_4_ * auVar97._24_4_;
          auVar49._28_4_ = auVar96._28_4_;
          auVar8 = vfmsub231ps_fma(auVar49,auVar93,auVar91);
          auVar82 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar87),ZEXT1632(auVar8));
          auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar179),auVar100);
          auVar94 = vrcp14ps_avx512vl(auVar91);
          auVar92 = vfnmadd213ps_avx512vl(auVar94,auVar91,auVar99);
          auVar82 = vfmadd132ps_fma(auVar92,auVar94,auVar94);
          auVar50._4_4_ = auVar8._4_4_ * auVar109._4_4_;
          auVar50._0_4_ = auVar8._0_4_ * auVar109._0_4_;
          auVar50._8_4_ = auVar8._8_4_ * auVar109._8_4_;
          auVar50._12_4_ = auVar8._12_4_ * auVar109._12_4_;
          auVar50._16_4_ = fVar134 * 0.0;
          auVar50._20_4_ = fVar163 * 0.0;
          auVar50._24_4_ = fVar138 * 0.0;
          auVar50._28_4_ = iVar1;
          auVar87 = vfmadd231ps_fma(auVar50,auVar103,ZEXT1632(auVar87));
          auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar104,ZEXT1632(auVar179));
          fVar134 = auVar82._0_4_;
          fVar138 = auVar82._4_4_;
          fVar139 = auVar82._8_4_;
          fVar140 = auVar82._12_4_;
          local_220 = ZEXT1632(CONCAT412(auVar87._12_4_ * fVar140,
                                         CONCAT48(auVar87._8_4_ * fVar139,
                                                  CONCAT44(auVar87._4_4_ * fVar138,
                                                           auVar87._0_4_ * fVar134))));
          auVar167._8_4_ = 3;
          auVar167._0_8_ = 0x300000003;
          auVar167._12_4_ = 3;
          auVar167._16_4_ = 3;
          auVar167._20_4_ = 3;
          auVar167._24_4_ = 3;
          auVar167._28_4_ = 3;
          auVar94 = vpermps_avx2(auVar167,ZEXT1632((undefined1  [16])aVar3));
          uVar141 = vcmpps_avx512vl(auVar94,local_220,2);
          fVar163 = ray->tfar;
          auVar28._4_4_ = fVar163;
          auVar28._0_4_ = fVar163;
          auVar28._8_4_ = fVar163;
          auVar28._12_4_ = fVar163;
          auVar28._16_4_ = fVar163;
          auVar28._20_4_ = fVar163;
          auVar28._24_4_ = fVar163;
          auVar28._28_4_ = fVar163;
          uVar23 = vcmpps_avx512vl(local_220,auVar28,2);
          bVar79 = (byte)uVar141 & (byte)uVar23 & bVar79;
          if (bVar79 != 0) {
            uVar141 = vcmpps_avx512vl(auVar91,auVar100,4);
            bVar79 = bVar79 & (byte)uVar141;
            if (bVar79 != 0) {
              fVar163 = auVar98._0_4_ * fVar134;
              fVar165 = auVar98._4_4_ * fVar138;
              auVar51._4_4_ = fVar165;
              auVar51._0_4_ = fVar163;
              fVar80 = auVar98._8_4_ * fVar139;
              auVar51._8_4_ = fVar80;
              fVar81 = auVar98._12_4_ * fVar140;
              auVar51._12_4_ = fVar81;
              fVar152 = auVar98._16_4_ * 0.0;
              auVar51._16_4_ = fVar152;
              fVar126 = auVar98._20_4_ * 0.0;
              auVar51._20_4_ = fVar126;
              fVar127 = auVar98._24_4_ * 0.0;
              auVar51._24_4_ = fVar127;
              auVar51._28_4_ = auVar91._28_4_;
              auVar94 = vsubps_avx512vl(auVar99,auVar51);
              local_260._0_4_ =
                   (float)((uint)(bVar71 & 1) * (int)fVar163 |
                          (uint)!(bool)(bVar71 & 1) * auVar94._0_4_);
              bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
              local_260._4_4_ = (float)((uint)bVar77 * (int)fVar165 | (uint)!bVar77 * auVar94._4_4_)
              ;
              bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
              local_260._8_4_ = (float)((uint)bVar77 * (int)fVar80 | (uint)!bVar77 * auVar94._8_4_);
              bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
              local_260._12_4_ =
                   (float)((uint)bVar77 * (int)fVar81 | (uint)!bVar77 * auVar94._12_4_);
              bVar77 = (bool)((byte)(uVar73 >> 4) & 1);
              local_260._16_4_ =
                   (float)((uint)bVar77 * (int)fVar152 | (uint)!bVar77 * auVar94._16_4_);
              bVar77 = (bool)((byte)(uVar73 >> 5) & 1);
              local_260._20_4_ =
                   (float)((uint)bVar77 * (int)fVar126 | (uint)!bVar77 * auVar94._20_4_);
              bVar77 = (bool)((byte)(uVar73 >> 6) & 1);
              local_260._24_4_ =
                   (float)((uint)bVar77 * (int)fVar127 | (uint)!bVar77 * auVar94._24_4_);
              bVar77 = SUB81(uVar73 >> 7,0);
              local_260._28_4_ =
                   (float)((uint)bVar77 * auVar91._28_4_ | (uint)!bVar77 * auVar94._28_4_);
              auVar94 = vsubps_avx(ZEXT1632(auVar11),auVar89);
              auVar82 = vfmadd213ps_fma(auVar94,local_260,auVar89);
              fVar163 = pre->depth_scale;
              auVar29._4_4_ = fVar163;
              auVar29._0_4_ = fVar163;
              auVar29._8_4_ = fVar163;
              auVar29._12_4_ = fVar163;
              auVar29._16_4_ = fVar163;
              auVar29._20_4_ = fVar163;
              auVar29._24_4_ = fVar163;
              auVar29._28_4_ = fVar163;
              auVar94 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar82._12_4_ + auVar82._12_4_,
                                                           CONCAT48(auVar82._8_4_ + auVar82._8_4_,
                                                                    CONCAT44(auVar82._4_4_ +
                                                                             auVar82._4_4_,
                                                                             auVar82._0_4_ +
                                                                             auVar82._0_4_)))),
                                        auVar29);
              uVar141 = vcmpps_avx512vl(local_220,auVar94,6);
              if (((byte)uVar141 & bVar79) != 0) {
                auVar6._0_4_ = ray->tfar;
                auVar6._4_4_ = ray->mask;
                auVar6._8_4_ = ray->id;
                auVar6._12_4_ = ray->flags;
                uVar72 = vextractps_avx(auVar6,1);
                auVar153._0_4_ = auVar90._0_4_ * fVar134;
                auVar153._4_4_ = auVar90._4_4_ * fVar138;
                auVar153._8_4_ = auVar90._8_4_ * fVar139;
                auVar153._12_4_ = auVar90._12_4_ * fVar140;
                auVar153._16_4_ = auVar90._16_4_ * 0.0;
                auVar153._20_4_ = auVar90._20_4_ * 0.0;
                auVar153._24_4_ = auVar90._24_4_ * 0.0;
                auVar153._28_4_ = 0;
                auVar94 = vsubps_avx512vl(auVar99,auVar153);
                auVar115._0_4_ =
                     (uint)(bVar71 & 1) * (int)auVar153._0_4_ |
                     (uint)!(bool)(bVar71 & 1) * auVar94._0_4_;
                bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
                auVar115._4_4_ = (uint)bVar77 * (int)auVar153._4_4_ | (uint)!bVar77 * auVar94._4_4_;
                bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
                auVar115._8_4_ = (uint)bVar77 * (int)auVar153._8_4_ | (uint)!bVar77 * auVar94._8_4_;
                bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
                auVar115._12_4_ =
                     (uint)bVar77 * (int)auVar153._12_4_ | (uint)!bVar77 * auVar94._12_4_;
                bVar77 = (bool)((byte)(uVar73 >> 4) & 1);
                auVar115._16_4_ =
                     (uint)bVar77 * (int)auVar153._16_4_ | (uint)!bVar77 * auVar94._16_4_;
                bVar77 = (bool)((byte)(uVar73 >> 5) & 1);
                auVar115._20_4_ =
                     (uint)bVar77 * (int)auVar153._20_4_ | (uint)!bVar77 * auVar94._20_4_;
                bVar77 = (bool)((byte)(uVar73 >> 6) & 1);
                auVar115._24_4_ =
                     (uint)bVar77 * (int)auVar153._24_4_ | (uint)!bVar77 * auVar94._24_4_;
                auVar115._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar94._28_4_;
                auVar30._8_4_ = 0x40000000;
                auVar30._0_8_ = 0x4000000040000000;
                auVar30._12_4_ = 0x40000000;
                auVar30._16_4_ = 0x40000000;
                auVar30._20_4_ = 0x40000000;
                auVar30._24_4_ = 0x40000000;
                auVar30._28_4_ = 0x40000000;
                local_240 = vfmsub132ps_avx512vl(auVar115,auVar99,auVar30);
                local_200 = 0;
                local_1fc = iVar14;
                local_1f0 = local_470;
                local_1e0 = local_480._0_8_;
                uStack_1d8 = local_480._8_8_;
                local_1d0 = local_490._0_8_;
                uStack_1c8 = local_490._8_8_;
                if ((pGVar15->mask & uVar72) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar77 = true, local_490 = auVar12, local_480 = auVar142,
                     pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar163 = 1.0 / auVar172._0_4_;
                    local_1a0[0] = fVar163 * (local_260._0_4_ + 0.0);
                    local_1a0[1] = fVar163 * (local_260._4_4_ + 1.0);
                    local_1a0[2] = fVar163 * (local_260._8_4_ + 2.0);
                    local_1a0[3] = fVar163 * (local_260._12_4_ + 3.0);
                    fStack_190 = fVar163 * (local_260._16_4_ + 4.0);
                    fStack_18c = fVar163 * (local_260._20_4_ + 5.0);
                    fStack_188 = fVar163 * (local_260._24_4_ + 6.0);
                    fStack_184 = local_260._28_4_ + 7.0;
                    local_180 = local_240;
                    local_160 = local_220;
                    lVar76 = 0;
                    uVar75 = (ulong)((byte)uVar141 & bVar79);
                    for (uVar73 = uVar75; (uVar73 & 1) == 0;
                        uVar73 = uVar73 >> 1 | 0x8000000000000000) {
                      lVar76 = lVar76 + 1;
                    }
                    local_520 = auVar83;
                    local_4a0 = auVar6;
                    local_490 = auVar12;
                    local_480 = auVar142;
                    do {
                      auVar179 = auVar180._0_16_;
                      local_2c0._0_8_ = uVar75;
                      local_4d4 = local_1a0[lVar76];
                      local_4d0 = *(undefined4 *)(local_180 + lVar76 * 4);
                      local_2a0._0_8_ = lVar76;
                      local_548->tfar = *(float *)(local_160 + lVar76 * 4);
                      local_510.context = context->user;
                      fVar163 = 1.0 - local_4d4;
                      auVar26._8_4_ = 0x80000000;
                      auVar26._0_8_ = 0x8000000080000000;
                      auVar26._12_4_ = 0x80000000;
                      auVar87 = vxorps_avx512vl(ZEXT416((uint)fVar163),auVar26);
                      auVar83 = ZEXT416((uint)(local_4d4 * fVar163 * 4.0));
                      auVar82 = vfnmsub213ss_fma(ZEXT416((uint)local_4d4),ZEXT416((uint)local_4d4),
                                                 auVar83);
                      auVar83 = vfmadd213ss_fma(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),
                                                auVar83);
                      fVar163 = fVar163 * auVar87._0_4_ * 0.5;
                      fVar134 = auVar82._0_4_ * 0.5;
                      fVar138 = auVar83._0_4_ * 0.5;
                      fVar139 = local_4d4 * local_4d4 * 0.5;
                      auVar155._0_4_ = fVar139 * (float)local_310._0_4_;
                      auVar155._4_4_ = fVar139 * (float)local_310._4_4_;
                      auVar155._8_4_ = fVar139 * fStack_308;
                      auVar155._12_4_ = fVar139 * fStack_304;
                      auVar146._4_4_ = fVar138;
                      auVar146._0_4_ = fVar138;
                      auVar146._8_4_ = fVar138;
                      auVar146._12_4_ = fVar138;
                      auVar83 = vfmadd132ps_fma(auVar146,auVar155,local_490);
                      auVar156._4_4_ = fVar134;
                      auVar156._0_4_ = fVar134;
                      auVar156._8_4_ = fVar134;
                      auVar156._12_4_ = fVar134;
                      auVar83 = vfmadd132ps_fma(auVar156,auVar83,local_480);
                      auVar147._4_4_ = fVar163;
                      auVar147._0_4_ = fVar163;
                      auVar147._8_4_ = fVar163;
                      auVar147._12_4_ = fVar163;
                      auVar83 = vfmadd213ps_fma(auVar147,local_470,auVar83);
                      local_4e0 = vmovlps_avx(auVar83);
                      local_4d8 = vextractps_avx(auVar83,2);
                      local_4cc = local_52c;
                      local_4c8 = (int)local_528;
                      local_4c4 = (local_510.context)->instID[0];
                      local_4c0 = (local_510.context)->instPrimID[0];
                      local_54c = -1;
                      local_510.valid = &local_54c;
                      local_510.geometryUserPtr = pGVar15->userPtr;
                      local_510.ray = (RTCRayN *)local_548;
                      local_510.hit = (RTCHitN *)&local_4e0;
                      local_510.N = 1;
                      if ((pGVar15->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*pGVar15->occlusionFilterN)(&local_510), *local_510.valid != 0)) {
                        p_Var16 = context->args->filter;
                        if ((p_Var16 == (RTCFilterFunctionN)0x0) ||
                           ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                              RTC_RAY_QUERY_FLAG_INCOHERENT &&
                             (((pGVar15->field_8).field_0x2 & 0x40) == 0)) ||
                            ((*p_Var16)(&local_510), *local_510.valid != 0)))) {
                          bVar77 = true;
                          auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar181 = ZEXT3264(auVar94);
                          auVar83 = vxorps_avx512vl(auVar179,auVar179);
                          auVar180 = ZEXT1664(auVar83);
                          auVar178 = ZEXT3264(local_340);
                          auVar184 = ZEXT3264(local_360);
                          auVar187 = ZEXT3264(local_3e0);
                          auVar183 = ZEXT3264(local_380);
                          auVar189 = ZEXT3264(local_400);
                          auVar186 = ZEXT3264(local_420);
                          auVar185 = ZEXT3264(local_3a0);
                          auVar188 = ZEXT3264(local_440);
                          auVar182 = ZEXT3264(local_3c0);
                          pre = local_538;
                          auVar83 = local_520;
                          break;
                        }
                      }
                      local_548->tfar = (float)local_4a0._0_4_;
                      bVar77 = false;
                      lVar76 = 0;
                      uVar75 = local_2c0._0_8_ ^ 1L << (local_2a0._0_8_ & 0x3f);
                      for (uVar73 = uVar75; (uVar73 & 1) == 0;
                          uVar73 = uVar73 >> 1 | 0x8000000000000000) {
                        lVar76 = lVar76 + 1;
                      }
                      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar181 = ZEXT3264(auVar94);
                      auVar83 = vxorps_avx512vl(auVar179,auVar179);
                      auVar180 = ZEXT1664(auVar83);
                      auVar178 = ZEXT3264(local_340);
                      auVar184 = ZEXT3264(local_360);
                      auVar187 = ZEXT3264(local_3e0);
                      auVar183 = ZEXT3264(local_380);
                      auVar189 = ZEXT3264(local_400);
                      auVar186 = ZEXT3264(local_420);
                      auVar185 = ZEXT3264(local_3a0);
                      auVar188 = ZEXT3264(local_440);
                      auVar182 = ZEXT3264(local_3c0);
                      pre = local_538;
                      auVar83 = local_520;
                    } while (uVar75 != 0);
                  }
                  goto LAB_01cb7b82;
                }
              }
            }
          }
        }
        bVar77 = false;
        local_490 = auVar12;
        local_480 = auVar142;
      }
LAB_01cb7b82:
      if (8 < iVar14) {
        local_2a0 = vpbroadcastd_avx512vl();
        local_2c0 = vbroadcastss_avx512vl(auVar83);
        auVar137._8_4_ = 3;
        auVar137._0_8_ = 0x300000003;
        auVar137._12_4_ = 3;
        auVar137._16_4_ = 3;
        auVar137._20_4_ = 3;
        auVar137._24_4_ = 3;
        auVar137._28_4_ = 3;
        local_2e0 = vpermps_avx2(auVar137,local_2e0);
        local_300._4_4_ = 1.0 / (float)local_300._0_4_;
        local_300._0_4_ = local_300._4_4_;
        fStack_2f8 = (float)local_300._4_4_;
        fStack_2f4 = (float)local_300._4_4_;
        fStack_2f0 = (float)local_300._4_4_;
        fStack_2ec = (float)local_300._4_4_;
        fStack_2e8 = (float)local_300._4_4_;
        fStack_2e4 = (float)local_300._4_4_;
        lVar76 = 8;
        do {
          auVar94 = vpbroadcastd_avx512vl();
          auVar96 = vpor_avx2(auVar94,_DAT_01fe9900);
          uVar23 = vpcmpd_avx512vl(auVar96,local_2a0,1);
          auVar94 = *(undefined1 (*) [32])(bspline_basis0 + lVar76 * 4 + lVar24);
          auVar91 = *(undefined1 (*) [32])(lVar24 + 0x21aefac + lVar76 * 4);
          auVar92 = *(undefined1 (*) [32])(lVar24 + 0x21af430 + lVar76 * 4);
          auVar93 = *(undefined1 (*) [32])(lVar24 + 0x21af8b4 + lVar76 * 4);
          local_3a0 = auVar185._0_32_;
          auVar95 = vmulps_avx512vl(local_3a0,auVar93);
          auVar150 = auVar188._0_32_;
          auVar104 = vmulps_avx512vl(auVar150,auVar93);
          auVar52._4_4_ = auVar93._4_4_ * (float)local_100._4_4_;
          auVar52._0_4_ = auVar93._0_4_ * (float)local_100._0_4_;
          auVar52._8_4_ = auVar93._8_4_ * fStack_f8;
          auVar52._12_4_ = auVar93._12_4_ * fStack_f4;
          auVar52._16_4_ = auVar93._16_4_ * fStack_f0;
          auVar52._20_4_ = auVar93._20_4_ * fStack_ec;
          auVar52._24_4_ = auVar93._24_4_ * fStack_e8;
          auVar52._28_4_ = auVar96._28_4_;
          auVar164 = auVar189._0_32_;
          auVar96 = vfmadd231ps_avx512vl(auVar95,auVar92,auVar164);
          auVar102 = auVar186._0_32_;
          auVar95 = vfmadd231ps_avx512vl(auVar104,auVar92,auVar102);
          auVar104 = vfmadd231ps_avx512vl(auVar52,auVar92,local_e0);
          auVar144 = auVar187._0_32_;
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar91,auVar144);
          local_380 = auVar183._0_32_;
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,local_380);
          auVar83 = vfmadd231ps_fma(auVar104,auVar91,local_c0);
          local_340 = auVar178._0_32_;
          auVar82 = vfmadd231ps_fma(auVar96,auVar94,local_340);
          local_360 = auVar184._0_32_;
          auVar90 = vfmadd231ps_avx512vl(auVar95,auVar94,local_360);
          auVar96 = *(undefined1 (*) [32])(bspline_basis1 + lVar76 * 4 + lVar24);
          auVar95 = *(undefined1 (*) [32])(lVar24 + 0x21b13cc + lVar76 * 4);
          auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar94,local_a0);
          auVar104 = *(undefined1 (*) [32])(lVar24 + 0x21b1850 + lVar76 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar24 + 0x21b1cd4 + lVar76 * 4);
          auVar97 = vmulps_avx512vl(local_3a0,auVar103);
          auVar98 = vmulps_avx512vl(auVar150,auVar103);
          auVar53._4_4_ = auVar103._4_4_ * (float)local_100._4_4_;
          auVar53._0_4_ = auVar103._0_4_ * (float)local_100._0_4_;
          auVar53._8_4_ = auVar103._8_4_ * fStack_f8;
          auVar53._12_4_ = auVar103._12_4_ * fStack_f4;
          auVar53._16_4_ = auVar103._16_4_ * fStack_f0;
          auVar53._20_4_ = auVar103._20_4_ * fStack_ec;
          auVar53._24_4_ = auVar103._24_4_ * fStack_e8;
          auVar53._28_4_ = uStack_e4;
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar104,auVar164);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar104,auVar102);
          auVar99 = vfmadd231ps_avx512vl(auVar53,auVar104,local_e0);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar95,auVar144);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,local_380);
          auVar87 = vfmadd231ps_fma(auVar99,auVar95,local_c0);
          auVar99 = vfmadd231ps_avx512vl(auVar97,auVar96,local_340);
          auVar100 = vfmadd231ps_avx512vl(auVar98,auVar96,local_360);
          auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar96,local_a0);
          auVar88 = vmaxps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar87));
          auVar97 = vsubps_avx(auVar99,ZEXT1632(auVar82));
          auVar98 = vsubps_avx(auVar100,auVar90);
          auVar89 = vmulps_avx512vl(auVar90,auVar97);
          auVar101 = vmulps_avx512vl(ZEXT1632(auVar82),auVar98);
          auVar89 = vsubps_avx512vl(auVar89,auVar101);
          auVar101 = vmulps_avx512vl(auVar98,auVar98);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,auVar97);
          auVar88 = vmulps_avx512vl(auVar88,auVar88);
          auVar88 = vmulps_avx512vl(auVar88,auVar101);
          auVar89 = vmulps_avx512vl(auVar89,auVar89);
          uVar141 = vcmpps_avx512vl(auVar89,auVar88,2);
          bVar79 = (byte)uVar23 & (byte)uVar141;
          if (bVar79 == 0) {
            auVar178 = ZEXT3264(local_340);
          }
          else {
            local_3c0 = auVar182._0_32_;
            auVar103 = vmulps_avx512vl(local_460,auVar103);
            auVar104 = vfmadd213ps_avx512vl(auVar104,local_140,auVar103);
            auVar95 = vfmadd213ps_avx512vl(auVar95,local_120,auVar104);
            auVar96 = vfmadd213ps_avx512vl(auVar96,local_3c0,auVar95);
            auVar93 = vmulps_avx512vl(local_460,auVar93);
            auVar92 = vfmadd213ps_avx512vl(auVar92,local_140,auVar93);
            auVar91 = vfmadd213ps_avx512vl(auVar91,local_120,auVar92);
            auVar95 = vfmadd213ps_avx512vl(auVar94,local_3c0,auVar91);
            auVar94 = *(undefined1 (*) [32])(lVar24 + 0x21afd38 + lVar76 * 4);
            auVar91 = *(undefined1 (*) [32])(lVar24 + 0x21b01bc + lVar76 * 4);
            auVar92 = *(undefined1 (*) [32])(lVar24 + 0x21b0640 + lVar76 * 4);
            auVar93 = *(undefined1 (*) [32])(lVar24 + 0x21b0ac4 + lVar76 * 4);
            auVar104 = vmulps_avx512vl(local_3a0,auVar93);
            auVar103 = vmulps_avx512vl(auVar150,auVar93);
            auVar93 = vmulps_avx512vl(local_460,auVar93);
            auVar104 = vfmadd231ps_avx512vl(auVar104,auVar92,auVar164);
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar92,auVar102);
            auVar92 = vfmadd231ps_avx512vl(auVar93,local_140,auVar92);
            auVar93 = vfmadd231ps_avx512vl(auVar104,auVar91,auVar144);
            auVar104 = vfmadd231ps_avx512vl(auVar103,auVar91,local_380);
            auVar91 = vfmadd231ps_avx512vl(auVar92,local_120,auVar91);
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar94,local_340);
            auVar104 = vfmadd231ps_avx512vl(auVar104,auVar94,local_360);
            auVar103 = vfmadd231ps_avx512vl(auVar91,local_3c0,auVar94);
            auVar94 = *(undefined1 (*) [32])(lVar24 + 0x21b2158 + lVar76 * 4);
            auVar91 = *(undefined1 (*) [32])(lVar24 + 0x21b2a60 + lVar76 * 4);
            auVar92 = *(undefined1 (*) [32])(lVar24 + 0x21b2ee4 + lVar76 * 4);
            auVar88 = vmulps_avx512vl(local_3a0,auVar92);
            auVar89 = vmulps_avx512vl(auVar150,auVar92);
            auVar92 = vmulps_avx512vl(local_460,auVar92);
            auVar182 = ZEXT3264(local_3c0);
            auVar88 = vfmadd231ps_avx512vl(auVar88,auVar91,auVar164);
            auVar89 = vfmadd231ps_avx512vl(auVar89,auVar91,auVar102);
            auVar92 = vfmadd231ps_avx512vl(auVar92,local_140,auVar91);
            auVar91 = *(undefined1 (*) [32])(lVar24 + 0x21b25dc + lVar76 * 4);
            auVar88 = vfmadd231ps_avx512vl(auVar88,auVar91,auVar144);
            auVar89 = vfmadd231ps_avx512vl(auVar89,auVar91,local_380);
            auVar91 = vfmadd231ps_avx512vl(auVar92,local_120,auVar91);
            auVar92 = vfmadd231ps_avx512vl(auVar88,auVar94,local_340);
            auVar88 = vfmadd231ps_avx512vl(auVar89,auVar94,local_360);
            auVar91 = vfmadd231ps_avx512vl(auVar91,local_3c0,auVar94);
            auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar93,auVar89);
            vandps_avx512vl(auVar104,auVar89);
            auVar94 = vmaxps_avx(auVar89,auVar89);
            vandps_avx512vl(auVar103,auVar89);
            auVar94 = vmaxps_avx(auVar94,auVar89);
            uVar73 = vcmpps_avx512vl(auVar94,local_2c0,1);
            bVar17 = (bool)((byte)uVar73 & 1);
            auVar116._0_4_ = (float)((uint)bVar17 * auVar97._0_4_ | (uint)!bVar17 * auVar93._0_4_);
            bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar116._4_4_ = (float)((uint)bVar17 * auVar97._4_4_ | (uint)!bVar17 * auVar93._4_4_);
            bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar116._8_4_ = (float)((uint)bVar17 * auVar97._8_4_ | (uint)!bVar17 * auVar93._8_4_);
            bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar116._12_4_ =
                 (float)((uint)bVar17 * auVar97._12_4_ | (uint)!bVar17 * auVar93._12_4_);
            bVar17 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar116._16_4_ =
                 (float)((uint)bVar17 * auVar97._16_4_ | (uint)!bVar17 * auVar93._16_4_);
            bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar116._20_4_ =
                 (float)((uint)bVar17 * auVar97._20_4_ | (uint)!bVar17 * auVar93._20_4_);
            bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar116._24_4_ =
                 (float)((uint)bVar17 * auVar97._24_4_ | (uint)!bVar17 * auVar93._24_4_);
            bVar17 = SUB81(uVar73 >> 7,0);
            auVar116._28_4_ = (uint)bVar17 * auVar97._28_4_ | (uint)!bVar17 * auVar93._28_4_;
            bVar17 = (bool)((byte)uVar73 & 1);
            auVar117._0_4_ = (float)((uint)bVar17 * auVar98._0_4_ | (uint)!bVar17 * auVar104._0_4_);
            bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar117._4_4_ = (float)((uint)bVar17 * auVar98._4_4_ | (uint)!bVar17 * auVar104._4_4_);
            bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar117._8_4_ = (float)((uint)bVar17 * auVar98._8_4_ | (uint)!bVar17 * auVar104._8_4_);
            bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar117._12_4_ =
                 (float)((uint)bVar17 * auVar98._12_4_ | (uint)!bVar17 * auVar104._12_4_);
            bVar17 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar117._16_4_ =
                 (float)((uint)bVar17 * auVar98._16_4_ | (uint)!bVar17 * auVar104._16_4_);
            bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar117._20_4_ =
                 (float)((uint)bVar17 * auVar98._20_4_ | (uint)!bVar17 * auVar104._20_4_);
            bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar117._24_4_ =
                 (float)((uint)bVar17 * auVar98._24_4_ | (uint)!bVar17 * auVar104._24_4_);
            bVar17 = SUB81(uVar73 >> 7,0);
            auVar117._28_4_ = (uint)bVar17 * auVar98._28_4_ | (uint)!bVar17 * auVar104._28_4_;
            vandps_avx512vl(auVar92,auVar89);
            vandps_avx512vl(auVar88,auVar89);
            auVar94 = vmaxps_avx(auVar117,auVar117);
            vandps_avx512vl(auVar91,auVar89);
            auVar94 = vmaxps_avx(auVar94,auVar117);
            uVar73 = vcmpps_avx512vl(auVar94,local_2c0,1);
            bVar17 = (bool)((byte)uVar73 & 1);
            auVar118._0_4_ = (uint)bVar17 * auVar97._0_4_ | (uint)!bVar17 * auVar92._0_4_;
            bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar118._4_4_ = (uint)bVar17 * auVar97._4_4_ | (uint)!bVar17 * auVar92._4_4_;
            bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar118._8_4_ = (uint)bVar17 * auVar97._8_4_ | (uint)!bVar17 * auVar92._8_4_;
            bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar118._12_4_ = (uint)bVar17 * auVar97._12_4_ | (uint)!bVar17 * auVar92._12_4_;
            bVar17 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar118._16_4_ = (uint)bVar17 * auVar97._16_4_ | (uint)!bVar17 * auVar92._16_4_;
            bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar118._20_4_ = (uint)bVar17 * auVar97._20_4_ | (uint)!bVar17 * auVar92._20_4_;
            bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar118._24_4_ = (uint)bVar17 * auVar97._24_4_ | (uint)!bVar17 * auVar92._24_4_;
            bVar17 = SUB81(uVar73 >> 7,0);
            auVar118._28_4_ = (uint)bVar17 * auVar97._28_4_ | (uint)!bVar17 * auVar92._28_4_;
            bVar17 = (bool)((byte)uVar73 & 1);
            auVar119._0_4_ = (float)((uint)bVar17 * auVar98._0_4_ | (uint)!bVar17 * auVar88._0_4_);
            bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar119._4_4_ = (float)((uint)bVar17 * auVar98._4_4_ | (uint)!bVar17 * auVar88._4_4_);
            bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar119._8_4_ = (float)((uint)bVar17 * auVar98._8_4_ | (uint)!bVar17 * auVar88._8_4_);
            bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar119._12_4_ =
                 (float)((uint)bVar17 * auVar98._12_4_ | (uint)!bVar17 * auVar88._12_4_);
            bVar17 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar119._16_4_ =
                 (float)((uint)bVar17 * auVar98._16_4_ | (uint)!bVar17 * auVar88._16_4_);
            bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar119._20_4_ =
                 (float)((uint)bVar17 * auVar98._20_4_ | (uint)!bVar17 * auVar88._20_4_);
            bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar119._24_4_ =
                 (float)((uint)bVar17 * auVar98._24_4_ | (uint)!bVar17 * auVar88._24_4_);
            bVar17 = SUB81(uVar73 >> 7,0);
            auVar119._28_4_ = (uint)bVar17 * auVar98._28_4_ | (uint)!bVar17 * auVar88._28_4_;
            auVar170._8_4_ = 0x80000000;
            auVar170._0_8_ = 0x8000000080000000;
            auVar170._12_4_ = 0x80000000;
            auVar170._16_4_ = 0x80000000;
            auVar170._20_4_ = 0x80000000;
            auVar170._24_4_ = 0x80000000;
            auVar170._28_4_ = 0x80000000;
            auVar94 = vxorps_avx512vl(auVar118,auVar170);
            auVar101 = auVar180._0_32_;
            auVar91 = vfmadd213ps_avx512vl(auVar116,auVar116,auVar101);
            auVar179 = vfmadd231ps_fma(auVar91,auVar117,auVar117);
            auVar91 = vrsqrt14ps_avx512vl(ZEXT1632(auVar179));
            auVar177._8_4_ = 0xbf000000;
            auVar177._0_8_ = 0xbf000000bf000000;
            auVar177._12_4_ = 0xbf000000;
            auVar177._16_4_ = 0xbf000000;
            auVar177._20_4_ = 0xbf000000;
            auVar177._24_4_ = 0xbf000000;
            auVar177._28_4_ = 0xbf000000;
            fVar163 = auVar91._0_4_;
            fVar134 = auVar91._4_4_;
            fVar138 = auVar91._8_4_;
            fVar139 = auVar91._12_4_;
            fVar140 = auVar91._16_4_;
            fVar165 = auVar91._20_4_;
            fVar80 = auVar91._24_4_;
            auVar54._4_4_ = fVar134 * fVar134 * fVar134 * auVar179._4_4_ * -0.5;
            auVar54._0_4_ = fVar163 * fVar163 * fVar163 * auVar179._0_4_ * -0.5;
            auVar54._8_4_ = fVar138 * fVar138 * fVar138 * auVar179._8_4_ * -0.5;
            auVar54._12_4_ = fVar139 * fVar139 * fVar139 * auVar179._12_4_ * -0.5;
            auVar54._16_4_ = fVar140 * fVar140 * fVar140 * -0.0;
            auVar54._20_4_ = fVar165 * fVar165 * fVar165 * -0.0;
            auVar54._24_4_ = fVar80 * fVar80 * fVar80 * -0.0;
            auVar54._28_4_ = auVar117._28_4_;
            auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar91 = vfmadd231ps_avx512vl(auVar54,auVar92,auVar91);
            auVar55._4_4_ = auVar117._4_4_ * auVar91._4_4_;
            auVar55._0_4_ = auVar117._0_4_ * auVar91._0_4_;
            auVar55._8_4_ = auVar117._8_4_ * auVar91._8_4_;
            auVar55._12_4_ = auVar117._12_4_ * auVar91._12_4_;
            auVar55._16_4_ = auVar117._16_4_ * auVar91._16_4_;
            auVar55._20_4_ = auVar117._20_4_ * auVar91._20_4_;
            auVar55._24_4_ = auVar117._24_4_ * auVar91._24_4_;
            auVar55._28_4_ = 0;
            auVar56._4_4_ = auVar91._4_4_ * -auVar116._4_4_;
            auVar56._0_4_ = auVar91._0_4_ * -auVar116._0_4_;
            auVar56._8_4_ = auVar91._8_4_ * -auVar116._8_4_;
            auVar56._12_4_ = auVar91._12_4_ * -auVar116._12_4_;
            auVar56._16_4_ = auVar91._16_4_ * -auVar116._16_4_;
            auVar56._20_4_ = auVar91._20_4_ * -auVar116._20_4_;
            auVar56._24_4_ = auVar91._24_4_ * -auVar116._24_4_;
            auVar56._28_4_ = auVar117._28_4_;
            auVar93 = vmulps_avx512vl(auVar91,auVar101);
            auVar91 = vfmadd213ps_avx512vl(auVar118,auVar118,auVar101);
            auVar91 = vfmadd231ps_avx512vl(auVar91,auVar119,auVar119);
            auVar104 = vrsqrt14ps_avx512vl(auVar91);
            auVar91 = vmulps_avx512vl(auVar91,auVar177);
            fVar163 = auVar104._0_4_;
            fVar134 = auVar104._4_4_;
            fVar138 = auVar104._8_4_;
            fVar139 = auVar104._12_4_;
            fVar140 = auVar104._16_4_;
            fVar165 = auVar104._20_4_;
            fVar80 = auVar104._24_4_;
            auVar57._4_4_ = fVar134 * fVar134 * fVar134 * auVar91._4_4_;
            auVar57._0_4_ = fVar163 * fVar163 * fVar163 * auVar91._0_4_;
            auVar57._8_4_ = fVar138 * fVar138 * fVar138 * auVar91._8_4_;
            auVar57._12_4_ = fVar139 * fVar139 * fVar139 * auVar91._12_4_;
            auVar57._16_4_ = fVar140 * fVar140 * fVar140 * auVar91._16_4_;
            auVar57._20_4_ = fVar165 * fVar165 * fVar165 * auVar91._20_4_;
            auVar57._24_4_ = fVar80 * fVar80 * fVar80 * auVar91._24_4_;
            auVar57._28_4_ = auVar91._28_4_;
            auVar91 = vfmadd231ps_avx512vl(auVar57,auVar92,auVar104);
            auVar58._4_4_ = auVar119._4_4_ * auVar91._4_4_;
            auVar58._0_4_ = auVar119._0_4_ * auVar91._0_4_;
            auVar58._8_4_ = auVar119._8_4_ * auVar91._8_4_;
            auVar58._12_4_ = auVar119._12_4_ * auVar91._12_4_;
            auVar58._16_4_ = auVar119._16_4_ * auVar91._16_4_;
            auVar58._20_4_ = auVar119._20_4_ * auVar91._20_4_;
            auVar58._24_4_ = auVar119._24_4_ * auVar91._24_4_;
            auVar58._28_4_ = auVar104._28_4_;
            auVar59._4_4_ = auVar91._4_4_ * auVar94._4_4_;
            auVar59._0_4_ = auVar91._0_4_ * auVar94._0_4_;
            auVar59._8_4_ = auVar91._8_4_ * auVar94._8_4_;
            auVar59._12_4_ = auVar91._12_4_ * auVar94._12_4_;
            auVar59._16_4_ = auVar91._16_4_ * auVar94._16_4_;
            auVar59._20_4_ = auVar91._20_4_ * auVar94._20_4_;
            auVar59._24_4_ = auVar91._24_4_ * auVar94._24_4_;
            auVar59._28_4_ = auVar94._28_4_;
            auVar94 = vmulps_avx512vl(auVar91,auVar101);
            auVar179 = vfmadd213ps_fma(auVar55,ZEXT1632(auVar83),ZEXT1632(auVar82));
            auVar91 = ZEXT1632(auVar83);
            auVar8 = vfmadd213ps_fma(auVar56,auVar91,auVar90);
            auVar92 = vfmadd213ps_avx512vl(auVar93,auVar91,auVar95);
            auVar104 = vfmadd213ps_avx512vl(auVar58,ZEXT1632(auVar87),auVar99);
            auVar12 = vfnmadd213ps_fma(auVar55,auVar91,ZEXT1632(auVar82));
            auVar103 = ZEXT1632(auVar87);
            auVar82 = vfmadd213ps_fma(auVar59,auVar103,auVar100);
            auVar142 = vfnmadd213ps_fma(auVar56,auVar91,auVar90);
            auVar9 = vfmadd213ps_fma(auVar94,auVar103,auVar96);
            auVar88 = ZEXT1632(auVar83);
            auVar143 = vfnmadd231ps_fma(auVar95,auVar88,auVar93);
            auVar84 = vfnmadd213ps_fma(auVar58,auVar103,auVar99);
            auVar85 = vfnmadd213ps_fma(auVar59,auVar103,auVar100);
            auVar168 = vfnmadd231ps_fma(auVar96,ZEXT1632(auVar87),auVar94);
            auVar96 = vsubps_avx512vl(auVar104,ZEXT1632(auVar12));
            auVar94 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar142));
            auVar91 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar143));
            auVar60._4_4_ = auVar94._4_4_ * auVar143._4_4_;
            auVar60._0_4_ = auVar94._0_4_ * auVar143._0_4_;
            auVar60._8_4_ = auVar94._8_4_ * auVar143._8_4_;
            auVar60._12_4_ = auVar94._12_4_ * auVar143._12_4_;
            auVar60._16_4_ = auVar94._16_4_ * 0.0;
            auVar60._20_4_ = auVar94._20_4_ * 0.0;
            auVar60._24_4_ = auVar94._24_4_ * 0.0;
            auVar60._28_4_ = auVar93._28_4_;
            auVar83 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar142),auVar91);
            auVar61._4_4_ = auVar91._4_4_ * auVar12._4_4_;
            auVar61._0_4_ = auVar91._0_4_ * auVar12._0_4_;
            auVar61._8_4_ = auVar91._8_4_ * auVar12._8_4_;
            auVar61._12_4_ = auVar91._12_4_ * auVar12._12_4_;
            auVar61._16_4_ = auVar91._16_4_ * 0.0;
            auVar61._20_4_ = auVar91._20_4_ * 0.0;
            auVar61._24_4_ = auVar91._24_4_ * 0.0;
            auVar61._28_4_ = auVar91._28_4_;
            auVar10 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar143),auVar96);
            auVar62._4_4_ = auVar142._4_4_ * auVar96._4_4_;
            auVar62._0_4_ = auVar142._0_4_ * auVar96._0_4_;
            auVar62._8_4_ = auVar142._8_4_ * auVar96._8_4_;
            auVar62._12_4_ = auVar142._12_4_ * auVar96._12_4_;
            auVar62._16_4_ = auVar96._16_4_ * 0.0;
            auVar62._20_4_ = auVar96._20_4_ * 0.0;
            auVar62._24_4_ = auVar96._24_4_ * 0.0;
            auVar62._28_4_ = auVar96._28_4_;
            auVar11 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar12),auVar94);
            auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar11),auVar101,ZEXT1632(auVar10));
            auVar94 = vfmadd231ps_avx512vl(auVar94,auVar101,ZEXT1632(auVar83));
            uVar73 = vcmpps_avx512vl(auVar94,auVar101,2);
            bVar71 = (byte)uVar73;
            fVar126 = (float)((uint)(bVar71 & 1) * auVar179._0_4_ |
                             (uint)!(bool)(bVar71 & 1) * auVar84._0_4_);
            bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
            fVar128 = (float)((uint)bVar17 * auVar179._4_4_ | (uint)!bVar17 * auVar84._4_4_);
            bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
            fVar131 = (float)((uint)bVar17 * auVar179._8_4_ | (uint)!bVar17 * auVar84._8_4_);
            bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
            fVar132 = (float)((uint)bVar17 * auVar179._12_4_ | (uint)!bVar17 * auVar84._12_4_);
            auVar103 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar131,CONCAT44(fVar128,fVar126))));
            fVar127 = (float)((uint)(bVar71 & 1) * auVar8._0_4_ |
                             (uint)!(bool)(bVar71 & 1) * auVar85._0_4_);
            bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
            fVar130 = (float)((uint)bVar17 * auVar8._4_4_ | (uint)!bVar17 * auVar85._4_4_);
            bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
            fVar129 = (float)((uint)bVar17 * auVar8._8_4_ | (uint)!bVar17 * auVar85._8_4_);
            bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
            fVar133 = (float)((uint)bVar17 * auVar8._12_4_ | (uint)!bVar17 * auVar85._12_4_);
            auVar97 = ZEXT1632(CONCAT412(fVar133,CONCAT48(fVar129,CONCAT44(fVar130,fVar127))));
            auVar120._0_4_ =
                 (float)((uint)(bVar71 & 1) * auVar92._0_4_ |
                        (uint)!(bool)(bVar71 & 1) * auVar168._0_4_);
            bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar120._4_4_ = (float)((uint)bVar17 * auVar92._4_4_ | (uint)!bVar17 * auVar168._4_4_);
            bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar120._8_4_ = (float)((uint)bVar17 * auVar92._8_4_ | (uint)!bVar17 * auVar168._8_4_);
            bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar120._12_4_ =
                 (float)((uint)bVar17 * auVar92._12_4_ | (uint)!bVar17 * auVar168._12_4_);
            fVar163 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar92._16_4_);
            auVar120._16_4_ = fVar163;
            fVar134 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar92._20_4_);
            auVar120._20_4_ = fVar134;
            fVar138 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar92._24_4_);
            auVar120._24_4_ = fVar138;
            iVar1 = (uint)(byte)(uVar73 >> 7) * auVar92._28_4_;
            auVar120._28_4_ = iVar1;
            auVar94 = vblendmps_avx512vl(ZEXT1632(auVar12),auVar104);
            auVar121._0_4_ =
                 (uint)(bVar71 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar83._0_4_;
            bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar121._4_4_ = (uint)bVar17 * auVar94._4_4_ | (uint)!bVar17 * auVar83._4_4_;
            bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar121._8_4_ = (uint)bVar17 * auVar94._8_4_ | (uint)!bVar17 * auVar83._8_4_;
            bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar121._12_4_ = (uint)bVar17 * auVar94._12_4_ | (uint)!bVar17 * auVar83._12_4_;
            auVar121._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar94._16_4_;
            auVar121._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar94._20_4_;
            auVar121._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar94._24_4_;
            auVar121._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar94._28_4_;
            auVar94 = vblendmps_avx512vl(ZEXT1632(auVar142),ZEXT1632(auVar82));
            auVar122._0_4_ =
                 (float)((uint)(bVar71 & 1) * auVar94._0_4_ |
                        (uint)!(bool)(bVar71 & 1) * auVar179._0_4_);
            bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar122._4_4_ = (float)((uint)bVar17 * auVar94._4_4_ | (uint)!bVar17 * auVar179._4_4_);
            bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar122._8_4_ = (float)((uint)bVar17 * auVar94._8_4_ | (uint)!bVar17 * auVar179._8_4_);
            bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar122._12_4_ =
                 (float)((uint)bVar17 * auVar94._12_4_ | (uint)!bVar17 * auVar179._12_4_);
            fVar139 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar94._16_4_);
            auVar122._16_4_ = fVar139;
            fVar140 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar94._20_4_);
            auVar122._20_4_ = fVar140;
            fVar165 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar94._24_4_);
            auVar122._24_4_ = fVar165;
            auVar122._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar94._28_4_;
            auVar94 = vblendmps_avx512vl(ZEXT1632(auVar143),ZEXT1632(auVar9));
            auVar123._0_4_ =
                 (float)((uint)(bVar71 & 1) * auVar94._0_4_ |
                        (uint)!(bool)(bVar71 & 1) * auVar8._0_4_);
            bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar123._4_4_ = (float)((uint)bVar17 * auVar94._4_4_ | (uint)!bVar17 * auVar8._4_4_);
            bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar123._8_4_ = (float)((uint)bVar17 * auVar94._8_4_ | (uint)!bVar17 * auVar8._8_4_);
            bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar123._12_4_ = (float)((uint)bVar17 * auVar94._12_4_ | (uint)!bVar17 * auVar8._12_4_)
            ;
            fVar152 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar94._16_4_);
            auVar123._16_4_ = fVar152;
            fVar81 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar94._20_4_);
            auVar123._20_4_ = fVar81;
            fVar80 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar94._24_4_);
            auVar123._24_4_ = fVar80;
            iVar2 = (uint)(byte)(uVar73 >> 7) * auVar94._28_4_;
            auVar123._28_4_ = iVar2;
            auVar124._0_4_ =
                 (uint)(bVar71 & 1) * (int)auVar12._0_4_ |
                 (uint)!(bool)(bVar71 & 1) * auVar104._0_4_;
            bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar124._4_4_ = (uint)bVar17 * (int)auVar12._4_4_ | (uint)!bVar17 * auVar104._4_4_;
            bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar124._8_4_ = (uint)bVar17 * (int)auVar12._8_4_ | (uint)!bVar17 * auVar104._8_4_;
            bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar124._12_4_ = (uint)bVar17 * (int)auVar12._12_4_ | (uint)!bVar17 * auVar104._12_4_;
            auVar124._16_4_ = (uint)!(bool)((byte)(uVar73 >> 4) & 1) * auVar104._16_4_;
            auVar124._20_4_ = (uint)!(bool)((byte)(uVar73 >> 5) & 1) * auVar104._20_4_;
            auVar124._24_4_ = (uint)!(bool)((byte)(uVar73 >> 6) & 1) * auVar104._24_4_;
            auVar124._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar104._28_4_;
            bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
            bVar20 = (bool)((byte)(uVar73 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar73 >> 3) & 1);
            bVar18 = (bool)((byte)(uVar73 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar73 >> 2) & 1);
            bVar22 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar104 = vsubps_avx512vl(auVar124,auVar103);
            auVar91 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar142._12_4_ |
                                                    (uint)!bVar21 * auVar82._12_4_,
                                                    CONCAT48((uint)bVar20 * (int)auVar142._8_4_ |
                                                             (uint)!bVar20 * auVar82._8_4_,
                                                             CONCAT44((uint)bVar17 *
                                                                      (int)auVar142._4_4_ |
                                                                      (uint)!bVar17 * auVar82._4_4_,
                                                                      (uint)(bVar71 & 1) *
                                                                      (int)auVar142._0_4_ |
                                                                      (uint)!(bool)(bVar71 & 1) *
                                                                      auVar82._0_4_)))),auVar97);
            auVar92 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar143._12_4_ |
                                                    (uint)!bVar22 * auVar9._12_4_,
                                                    CONCAT48((uint)bVar19 * (int)auVar143._8_4_ |
                                                             (uint)!bVar19 * auVar9._8_4_,
                                                             CONCAT44((uint)bVar18 *
                                                                      (int)auVar143._4_4_ |
                                                                      (uint)!bVar18 * auVar9._4_4_,
                                                                      (uint)(bVar71 & 1) *
                                                                      (int)auVar143._0_4_ |
                                                                      (uint)!(bool)(bVar71 & 1) *
                                                                      auVar9._0_4_)))),auVar120);
            auVar93 = vsubps_avx(auVar103,auVar121);
            auVar96 = vsubps_avx(auVar97,auVar122);
            auVar95 = vsubps_avx(auVar120,auVar123);
            auVar63._4_4_ = auVar92._4_4_ * fVar128;
            auVar63._0_4_ = auVar92._0_4_ * fVar126;
            auVar63._8_4_ = auVar92._8_4_ * fVar131;
            auVar63._12_4_ = auVar92._12_4_ * fVar132;
            auVar63._16_4_ = auVar92._16_4_ * 0.0;
            auVar63._20_4_ = auVar92._20_4_ * 0.0;
            auVar63._24_4_ = auVar92._24_4_ * 0.0;
            auVar63._28_4_ = 0;
            auVar83 = vfmsub231ps_fma(auVar63,auVar120,auVar104);
            auVar154._0_4_ = fVar127 * auVar104._0_4_;
            auVar154._4_4_ = fVar130 * auVar104._4_4_;
            auVar154._8_4_ = fVar129 * auVar104._8_4_;
            auVar154._12_4_ = fVar133 * auVar104._12_4_;
            auVar154._16_4_ = auVar104._16_4_ * 0.0;
            auVar154._20_4_ = auVar104._20_4_ * 0.0;
            auVar154._24_4_ = auVar104._24_4_ * 0.0;
            auVar154._28_4_ = 0;
            auVar82 = vfmsub231ps_fma(auVar154,auVar103,auVar91);
            auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar101,ZEXT1632(auVar83));
            auVar161._0_4_ = auVar91._0_4_ * auVar120._0_4_;
            auVar161._4_4_ = auVar91._4_4_ * auVar120._4_4_;
            auVar161._8_4_ = auVar91._8_4_ * auVar120._8_4_;
            auVar161._12_4_ = auVar91._12_4_ * auVar120._12_4_;
            auVar161._16_4_ = auVar91._16_4_ * fVar163;
            auVar161._20_4_ = auVar91._20_4_ * fVar134;
            auVar161._24_4_ = auVar91._24_4_ * fVar138;
            auVar161._28_4_ = 0;
            auVar83 = vfmsub231ps_fma(auVar161,auVar97,auVar92);
            auVar98 = vfmadd231ps_avx512vl(auVar94,auVar101,ZEXT1632(auVar83));
            auVar94 = vmulps_avx512vl(auVar95,auVar121);
            auVar94 = vfmsub231ps_avx512vl(auVar94,auVar93,auVar123);
            auVar64._4_4_ = auVar96._4_4_ * auVar123._4_4_;
            auVar64._0_4_ = auVar96._0_4_ * auVar123._0_4_;
            auVar64._8_4_ = auVar96._8_4_ * auVar123._8_4_;
            auVar64._12_4_ = auVar96._12_4_ * auVar123._12_4_;
            auVar64._16_4_ = auVar96._16_4_ * fVar152;
            auVar64._20_4_ = auVar96._20_4_ * fVar81;
            auVar64._24_4_ = auVar96._24_4_ * fVar80;
            auVar64._28_4_ = iVar2;
            auVar83 = vfmsub231ps_fma(auVar64,auVar122,auVar95);
            auVar162._0_4_ = auVar122._0_4_ * auVar93._0_4_;
            auVar162._4_4_ = auVar122._4_4_ * auVar93._4_4_;
            auVar162._8_4_ = auVar122._8_4_ * auVar93._8_4_;
            auVar162._12_4_ = auVar122._12_4_ * auVar93._12_4_;
            auVar162._16_4_ = fVar139 * auVar93._16_4_;
            auVar162._20_4_ = fVar140 * auVar93._20_4_;
            auVar162._24_4_ = fVar165 * auVar93._24_4_;
            auVar162._28_4_ = 0;
            auVar82 = vfmsub231ps_fma(auVar162,auVar96,auVar121);
            auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar101,auVar94);
            auVar90 = vfmadd231ps_avx512vl(auVar94,auVar101,ZEXT1632(auVar83));
            auVar94 = vmaxps_avx(auVar98,auVar90);
            uVar141 = vcmpps_avx512vl(auVar94,auVar101,2);
            bVar79 = bVar79 & (byte)uVar141;
            if (bVar79 != 0) {
              auVar65._4_4_ = auVar95._4_4_ * auVar91._4_4_;
              auVar65._0_4_ = auVar95._0_4_ * auVar91._0_4_;
              auVar65._8_4_ = auVar95._8_4_ * auVar91._8_4_;
              auVar65._12_4_ = auVar95._12_4_ * auVar91._12_4_;
              auVar65._16_4_ = auVar95._16_4_ * auVar91._16_4_;
              auVar65._20_4_ = auVar95._20_4_ * auVar91._20_4_;
              auVar65._24_4_ = auVar95._24_4_ * auVar91._24_4_;
              auVar65._28_4_ = auVar94._28_4_;
              auVar179 = vfmsub231ps_fma(auVar65,auVar96,auVar92);
              auVar66._4_4_ = auVar92._4_4_ * auVar93._4_4_;
              auVar66._0_4_ = auVar92._0_4_ * auVar93._0_4_;
              auVar66._8_4_ = auVar92._8_4_ * auVar93._8_4_;
              auVar66._12_4_ = auVar92._12_4_ * auVar93._12_4_;
              auVar66._16_4_ = auVar92._16_4_ * auVar93._16_4_;
              auVar66._20_4_ = auVar92._20_4_ * auVar93._20_4_;
              auVar66._24_4_ = auVar92._24_4_ * auVar93._24_4_;
              auVar66._28_4_ = auVar92._28_4_;
              auVar82 = vfmsub231ps_fma(auVar66,auVar104,auVar95);
              auVar67._4_4_ = auVar96._4_4_ * auVar104._4_4_;
              auVar67._0_4_ = auVar96._0_4_ * auVar104._0_4_;
              auVar67._8_4_ = auVar96._8_4_ * auVar104._8_4_;
              auVar67._12_4_ = auVar96._12_4_ * auVar104._12_4_;
              auVar67._16_4_ = auVar96._16_4_ * auVar104._16_4_;
              auVar67._20_4_ = auVar96._20_4_ * auVar104._20_4_;
              auVar67._24_4_ = auVar96._24_4_ * auVar104._24_4_;
              auVar67._28_4_ = auVar96._28_4_;
              auVar8 = vfmsub231ps_fma(auVar67,auVar93,auVar91);
              auVar83 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar82),ZEXT1632(auVar8));
              auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar179),auVar101);
              auVar91 = vrcp14ps_avx512vl(auVar94);
              auVar93 = auVar181._0_32_;
              auVar92 = vfnmadd213ps_avx512vl(auVar91,auVar94,auVar93);
              auVar83 = vfmadd132ps_fma(auVar92,auVar91,auVar91);
              auVar68._4_4_ = auVar8._4_4_ * auVar120._4_4_;
              auVar68._0_4_ = auVar8._0_4_ * auVar120._0_4_;
              auVar68._8_4_ = auVar8._8_4_ * auVar120._8_4_;
              auVar68._12_4_ = auVar8._12_4_ * auVar120._12_4_;
              auVar68._16_4_ = fVar163 * 0.0;
              auVar68._20_4_ = fVar134 * 0.0;
              auVar68._24_4_ = fVar138 * 0.0;
              auVar68._28_4_ = iVar1;
              auVar82 = vfmadd231ps_fma(auVar68,auVar97,ZEXT1632(auVar82));
              auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar103,ZEXT1632(auVar179));
              fVar134 = auVar83._0_4_;
              fVar138 = auVar83._4_4_;
              fVar139 = auVar83._8_4_;
              fVar140 = auVar83._12_4_;
              local_220 = ZEXT1632(CONCAT412(auVar82._12_4_ * fVar140,
                                             CONCAT48(auVar82._8_4_ * fVar139,
                                                      CONCAT44(auVar82._4_4_ * fVar138,
                                                               auVar82._0_4_ * fVar134))));
              uVar141 = vcmpps_avx512vl(local_220,local_2e0,0xd);
              fVar163 = local_548->tfar;
              auVar32._4_4_ = fVar163;
              auVar32._0_4_ = fVar163;
              auVar32._8_4_ = fVar163;
              auVar32._12_4_ = fVar163;
              auVar32._16_4_ = fVar163;
              auVar32._20_4_ = fVar163;
              auVar32._24_4_ = fVar163;
              auVar32._28_4_ = fVar163;
              uVar23 = vcmpps_avx512vl(local_220,auVar32,2);
              bVar79 = (byte)uVar141 & (byte)uVar23 & bVar79;
              if (bVar79 != 0) {
                uVar141 = vcmpps_avx512vl(auVar94,auVar101,4);
                bVar79 = bVar79 & (byte)uVar141;
                auVar178 = ZEXT3264(local_340);
                if (bVar79 != 0) {
                  fVar163 = auVar98._0_4_ * fVar134;
                  fVar165 = auVar98._4_4_ * fVar138;
                  auVar69._4_4_ = fVar165;
                  auVar69._0_4_ = fVar163;
                  fVar80 = auVar98._8_4_ * fVar139;
                  auVar69._8_4_ = fVar80;
                  fVar81 = auVar98._12_4_ * fVar140;
                  auVar69._12_4_ = fVar81;
                  fVar152 = auVar98._16_4_ * 0.0;
                  auVar69._16_4_ = fVar152;
                  fVar126 = auVar98._20_4_ * 0.0;
                  auVar69._20_4_ = fVar126;
                  fVar127 = auVar98._24_4_ * 0.0;
                  auVar69._24_4_ = fVar127;
                  auVar69._28_4_ = auVar94._28_4_;
                  auVar91 = vsubps_avx512vl(auVar93,auVar69);
                  local_260._0_4_ =
                       (float)((uint)(bVar71 & 1) * (int)fVar163 |
                              (uint)!(bool)(bVar71 & 1) * auVar91._0_4_);
                  bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
                  local_260._4_4_ =
                       (float)((uint)bVar17 * (int)fVar165 | (uint)!bVar17 * auVar91._4_4_);
                  bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
                  local_260._8_4_ =
                       (float)((uint)bVar17 * (int)fVar80 | (uint)!bVar17 * auVar91._8_4_);
                  bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
                  local_260._12_4_ =
                       (float)((uint)bVar17 * (int)fVar81 | (uint)!bVar17 * auVar91._12_4_);
                  bVar17 = (bool)((byte)(uVar73 >> 4) & 1);
                  local_260._16_4_ =
                       (float)((uint)bVar17 * (int)fVar152 | (uint)!bVar17 * auVar91._16_4_);
                  bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
                  local_260._20_4_ =
                       (float)((uint)bVar17 * (int)fVar126 | (uint)!bVar17 * auVar91._20_4_);
                  bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
                  local_260._24_4_ =
                       (float)((uint)bVar17 * (int)fVar127 | (uint)!bVar17 * auVar91._24_4_);
                  bVar17 = SUB81(uVar73 >> 7,0);
                  local_260._28_4_ =
                       (float)((uint)bVar17 * auVar94._28_4_ | (uint)!bVar17 * auVar91._28_4_);
                  auVar94 = vsubps_avx(ZEXT1632(auVar87),auVar88);
                  auVar83 = vfmadd213ps_fma(auVar94,local_260,auVar88);
                  fVar163 = pre->depth_scale;
                  auVar33._4_4_ = fVar163;
                  auVar33._0_4_ = fVar163;
                  auVar33._8_4_ = fVar163;
                  auVar33._12_4_ = fVar163;
                  auVar33._16_4_ = fVar163;
                  auVar33._20_4_ = fVar163;
                  auVar33._24_4_ = fVar163;
                  auVar33._28_4_ = fVar163;
                  auVar94 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                                               CONCAT48(auVar83._8_4_ +
                                                                        auVar83._8_4_,
                                                                        CONCAT44(auVar83._4_4_ +
                                                                                 auVar83._4_4_,
                                                                                 auVar83._0_4_ +
                                                                                 auVar83._0_4_)))),
                                            auVar33);
                  uVar141 = vcmpps_avx512vl(local_220,auVar94,6);
                  if (((byte)uVar141 & bVar79) != 0) {
                    auVar7._0_4_ = local_548->tfar;
                    auVar7._4_4_ = local_548->mask;
                    auVar7._8_4_ = local_548->id;
                    auVar7._12_4_ = local_548->flags;
                    uVar72 = vextractps_avx(auVar7,1);
                    auVar145._0_4_ = auVar90._0_4_ * fVar134;
                    auVar145._4_4_ = auVar90._4_4_ * fVar138;
                    auVar145._8_4_ = auVar90._8_4_ * fVar139;
                    auVar145._12_4_ = auVar90._12_4_ * fVar140;
                    auVar145._16_4_ = auVar90._16_4_ * 0.0;
                    auVar145._20_4_ = auVar90._20_4_ * 0.0;
                    auVar145._24_4_ = auVar90._24_4_ * 0.0;
                    auVar145._28_4_ = 0;
                    auVar94 = vsubps_avx512vl(auVar93,auVar145);
                    auVar125._0_4_ =
                         (uint)(bVar71 & 1) * (int)auVar145._0_4_ |
                         (uint)!(bool)(bVar71 & 1) * auVar94._0_4_;
                    bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
                    auVar125._4_4_ =
                         (uint)bVar17 * (int)auVar145._4_4_ | (uint)!bVar17 * auVar94._4_4_;
                    bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
                    auVar125._8_4_ =
                         (uint)bVar17 * (int)auVar145._8_4_ | (uint)!bVar17 * auVar94._8_4_;
                    bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
                    auVar125._12_4_ =
                         (uint)bVar17 * (int)auVar145._12_4_ | (uint)!bVar17 * auVar94._12_4_;
                    bVar17 = (bool)((byte)(uVar73 >> 4) & 1);
                    auVar125._16_4_ =
                         (uint)bVar17 * (int)auVar145._16_4_ | (uint)!bVar17 * auVar94._16_4_;
                    bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
                    auVar125._20_4_ =
                         (uint)bVar17 * (int)auVar145._20_4_ | (uint)!bVar17 * auVar94._20_4_;
                    bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
                    auVar125._24_4_ =
                         (uint)bVar17 * (int)auVar145._24_4_ | (uint)!bVar17 * auVar94._24_4_;
                    auVar125._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar94._28_4_;
                    auVar34._8_4_ = 0x40000000;
                    auVar34._0_8_ = 0x4000000040000000;
                    auVar34._12_4_ = 0x40000000;
                    auVar34._16_4_ = 0x40000000;
                    auVar34._20_4_ = 0x40000000;
                    auVar34._24_4_ = 0x40000000;
                    auVar34._28_4_ = 0x40000000;
                    local_240 = vfmsub132ps_avx512vl(auVar125,auVar93,auVar34);
                    local_200 = (int)lVar76;
                    local_1fc = iVar14;
                    local_1f0 = local_470;
                    local_1e0 = local_480._0_8_;
                    uStack_1d8 = local_480._8_8_;
                    local_1d0 = local_490._0_8_;
                    uStack_1c8 = local_490._8_8_;
                    pGVar15 = (context->scene->geometries).items[local_528].ptr;
                    if ((pGVar15->mask & uVar72) == 0) {
                      bVar71 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar71 = 1, pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar83 = vcvtsi2ss_avx512f(auVar89._0_16_,(int)lVar76);
                      fVar163 = auVar83._0_4_;
                      local_1a0[0] = (fVar163 + local_260._0_4_ + 0.0) * (float)local_300._0_4_;
                      local_1a0[1] = (fVar163 + local_260._4_4_ + 1.0) * (float)local_300._4_4_;
                      local_1a0[2] = (fVar163 + local_260._8_4_ + 2.0) * fStack_2f8;
                      local_1a0[3] = (fVar163 + local_260._12_4_ + 3.0) * fStack_2f4;
                      fStack_190 = (fVar163 + local_260._16_4_ + 4.0) * fStack_2f0;
                      fStack_18c = (fVar163 + local_260._20_4_ + 5.0) * fStack_2ec;
                      fStack_188 = (fVar163 + local_260._24_4_ + 6.0) * fStack_2e8;
                      fStack_184 = fVar163 + local_260._28_4_ + 7.0;
                      local_180 = local_240;
                      local_160 = local_220;
                      uVar73 = CONCAT71(0,(byte)uVar141 & bVar79);
                      local_4a0._0_8_ = uVar73;
                      lVar25 = 0;
                      for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
                        lVar25 = lVar25 + 1;
                      }
                      local_520._0_8_ = lVar25;
                      local_4a8 = context;
                      local_270 = auVar7;
                      local_4b0 = pGVar15;
                      do {
                        auVar179 = auVar180._0_16_;
                        local_4d4 = local_1a0[local_520._0_8_];
                        local_4d0 = *(undefined4 *)(local_180 + local_520._0_8_ * 4);
                        local_548->tfar = *(float *)(local_160 + local_520._0_8_ * 4);
                        local_510.context = local_4a8->user;
                        fVar163 = 1.0 - local_4d4;
                        auVar27._8_4_ = 0x80000000;
                        auVar27._0_8_ = 0x8000000080000000;
                        auVar27._12_4_ = 0x80000000;
                        auVar87 = vxorps_avx512vl(ZEXT416((uint)fVar163),auVar27);
                        auVar83 = ZEXT416((uint)(local_4d4 * fVar163 * 4.0));
                        auVar82 = vfnmsub213ss_fma(ZEXT416((uint)local_4d4),ZEXT416((uint)local_4d4)
                                                   ,auVar83);
                        auVar83 = vfmadd213ss_fma(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),
                                                  auVar83);
                        fVar163 = fVar163 * auVar87._0_4_ * 0.5;
                        fVar134 = auVar82._0_4_ * 0.5;
                        fVar138 = auVar83._0_4_ * 0.5;
                        fVar139 = local_4d4 * local_4d4 * 0.5;
                        auVar157._0_4_ = fVar139 * (float)local_310._0_4_;
                        auVar157._4_4_ = fVar139 * (float)local_310._4_4_;
                        auVar157._8_4_ = fVar139 * fStack_308;
                        auVar157._12_4_ = fVar139 * fStack_304;
                        auVar148._4_4_ = fVar138;
                        auVar148._0_4_ = fVar138;
                        auVar148._8_4_ = fVar138;
                        auVar148._12_4_ = fVar138;
                        auVar83 = vfmadd132ps_fma(auVar148,auVar157,local_490);
                        auVar158._4_4_ = fVar134;
                        auVar158._0_4_ = fVar134;
                        auVar158._8_4_ = fVar134;
                        auVar158._12_4_ = fVar134;
                        auVar83 = vfmadd132ps_fma(auVar158,auVar83,local_480);
                        auVar149._4_4_ = fVar163;
                        auVar149._0_4_ = fVar163;
                        auVar149._8_4_ = fVar163;
                        auVar149._12_4_ = fVar163;
                        auVar83 = vfmadd213ps_fma(auVar149,local_470,auVar83);
                        local_4e0 = vmovlps_avx(auVar83);
                        local_4d8 = vextractps_avx(auVar83,2);
                        local_4cc = local_52c;
                        local_4c8 = (int)local_528;
                        local_4c4 = (local_510.context)->instID[0];
                        local_4c0 = (local_510.context)->instPrimID[0];
                        local_54c = -1;
                        local_510.valid = &local_54c;
                        local_510.geometryUserPtr = local_4b0->userPtr;
                        local_510.ray = (RTCRayN *)local_548;
                        local_510.hit = (RTCHitN *)&local_4e0;
                        local_510.N = 1;
                        if ((local_4b0->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                           ((*local_4b0->occlusionFilterN)(&local_510), *local_510.valid != 0)) {
                          p_Var16 = local_4a8->args->filter;
                          if ((p_Var16 == (RTCFilterFunctionN)0x0) ||
                             ((((local_4a8->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                == RTC_RAY_QUERY_FLAG_INCOHERENT &&
                               (((local_4b0->field_8).field_0x2 & 0x40) == 0)) ||
                              ((*p_Var16)(&local_510), *local_510.valid != 0)))) {
                            bVar71 = 1;
                            auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar181 = ZEXT3264(auVar94);
                            auVar83 = vxorps_avx512vl(auVar179,auVar179);
                            auVar180 = ZEXT1664(auVar83);
                            auVar178 = ZEXT3264(local_340);
                            auVar184 = ZEXT3264(local_360);
                            auVar187 = ZEXT3264(local_3e0);
                            auVar183 = ZEXT3264(local_380);
                            auVar189 = ZEXT3264(local_400);
                            auVar186 = ZEXT3264(local_420);
                            auVar185 = ZEXT3264(local_3a0);
                            auVar188 = ZEXT3264(local_440);
                            auVar182 = ZEXT3264(local_3c0);
                            context = local_4a8;
                            pre = local_538;
                            break;
                          }
                        }
                        local_548->tfar = (float)local_270._0_4_;
                        uVar75 = local_4a0._0_8_ ^ 1L << (local_520._0_8_ & 0x3f);
                        bVar71 = 0;
                        local_4a0._0_8_ = uVar75;
                        lVar25 = 0;
                        for (uVar73 = uVar75; (uVar73 & 1) == 0;
                            uVar73 = uVar73 >> 1 | 0x8000000000000000) {
                          lVar25 = lVar25 + 1;
                        }
                        local_520._0_8_ = lVar25;
                        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar181 = ZEXT3264(auVar94);
                        auVar83 = vxorps_avx512vl(auVar179,auVar179);
                        auVar180 = ZEXT1664(auVar83);
                        auVar178 = ZEXT3264(local_340);
                        auVar184 = ZEXT3264(local_360);
                        auVar187 = ZEXT3264(local_3e0);
                        auVar183 = ZEXT3264(local_380);
                        auVar189 = ZEXT3264(local_400);
                        auVar186 = ZEXT3264(local_420);
                        auVar185 = ZEXT3264(local_3a0);
                        auVar188 = ZEXT3264(local_440);
                        auVar182 = ZEXT3264(local_3c0);
                        context = local_4a8;
                        pre = local_538;
                      } while (uVar75 != 0);
                    }
                    bVar77 = (bool)(bVar77 | bVar71);
                  }
                }
                goto LAB_01cb85c3;
              }
            }
            auVar178 = ZEXT3264(local_340);
          }
LAB_01cb85c3:
          lVar76 = lVar76 + 8;
        } while ((int)lVar76 < iVar14);
      }
      if (bVar77) {
        return bVar77;
      }
      fVar163 = local_548->tfar;
      auVar31._4_4_ = fVar163;
      auVar31._0_4_ = fVar163;
      auVar31._8_4_ = fVar163;
      auVar31._12_4_ = fVar163;
      auVar31._16_4_ = fVar163;
      auVar31._20_4_ = fVar163;
      auVar31._24_4_ = fVar163;
      auVar31._28_4_ = fVar163;
      uVar141 = vcmpps_avx512vl(local_80,auVar31,2);
      uVar72 = (uint)uVar78 & (uint)uVar141;
      uVar78 = (ulong)uVar72;
      ray = local_548;
    } while (uVar72 != 0);
  }
  return bVar77;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }
          
          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }